

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  uchar uVar3;
  short sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  byte bVar30;
  short sVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  stbi_uc sVar38;
  byte bVar39;
  int iVar40;
  stbi__uint32 sVar41;
  uint uVar42;
  int iVar43;
  stbi__jpeg *psVar44;
  byte *pbVar45;
  byte *pbVar46;
  stbi__context *psVar47;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar48;
  void *pvVar49;
  code *pcVar50;
  stbi__context *psVar51;
  uchar *puVar52;
  stbi_uc *psVar53;
  long lVar54;
  long lVar55;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int why;
  uint uVar56;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar57;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  stbi__uint32 sVar58;
  ulong uVar59;
  stbi_uc *psVar60;
  stbi_uc *psVar61;
  int iVar62;
  stbi__uint32 sVar63;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  short *psVar64;
  int iVar65;
  int iVar66;
  uint uVar67;
  int iVar68;
  ulong uVar69;
  int *piVar70;
  ulong uVar71;
  ulong uVar72;
  int iVar73;
  uint uVar74;
  stbi_uc (*pasVar75) [4];
  bool bVar76;
  undefined1 auVar77 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_8970;
  uint local_8944;
  int local_8934;
  uint local_8920;
  int local_8904;
  uint local_88ec;
  stbi__bmp_data local_88e8;
  ulong local_88c8;
  undefined4 local_88c0;
  uint local_88bc;
  undefined8 local_88b8;
  stbi__uint32 local_88b0;
  int local_88ac;
  stbi__gif local_88a8;
  
  psVar61 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar44 = (stbi__jpeg *)malloc(0x4888);
  psVar44->s = s;
  psVar44->idct_block_kernel = stbi__idct_simd;
  psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar44->jfif = 0;
  psVar44->app14_color_transform = -1;
  psVar44->marker = 0xff;
  sVar38 = stbi__get_marker(psVar44);
  if (sVar38 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar44);
  if (sVar38 == 0xd8) {
    psVar44 = (stbi__jpeg *)malloc(0x4888);
    psVar44->s = s;
    psVar44->idct_block_kernel = stbi__idct_simd;
    psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar44->img_comp[0].raw_data = (void *)0x0;
      psVar44->img_comp[0].raw_coeff = (void *)0x0;
      psVar44->img_comp[1].raw_data = (void *)0x0;
      psVar44->img_comp[1].raw_coeff = (void *)0x0;
      psVar44->img_comp[2].raw_data = (void *)0x0;
      psVar44->img_comp[2].raw_coeff = (void *)0x0;
      psVar44->img_comp[3].raw_data = (void *)0x0;
      psVar44->img_comp[3].raw_coeff = (void *)0x0;
      psVar44->restart_interval = 0;
      iVar40 = stbi__decode_jpeg_header(psVar44,0);
      uVar74 = extraout_EDX;
      if (iVar40 != 0) {
        paVar1 = psVar44->img_comp;
        bVar39 = stbi__get_marker(psVar44);
LAB_001c9c4d:
        if (bVar39 == 0xda) {
          iVar40 = stbi__get16be(psVar44->s);
          psVar51 = psVar44->s;
          pbVar46 = psVar51->img_buffer;
          paVar57 = extraout_RDX_00;
          if (psVar51->img_buffer_end <= pbVar46) {
            if (psVar51->read_from_callbacks != 0) {
              psVar61 = psVar51->buffer_start;
              iVar68 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
              if (iVar68 == 0) {
                psVar51->read_from_callbacks = 0;
                psVar60 = psVar51->buffer_start + 1;
                psVar51->buffer_start[0] = '\0';
                bVar39 = 0;
              }
              else {
                psVar60 = psVar61 + iVar68;
                bVar39 = *psVar61;
              }
              psVar51->img_buffer_end = psVar60;
              psVar51->img_buffer = psVar51->buffer_start + 1;
              paVar57 = extraout_RDX_01;
              goto LAB_001c9d3c;
            }
            psVar44->scan_n = 0;
LAB_001cb8bd:
            stbi__g_failure_reason = "bad SOS component count";
            goto LAB_001cb8c4;
          }
          psVar51->img_buffer = pbVar46 + 1;
          bVar39 = *pbVar46;
LAB_001c9d3c:
          uVar74 = (uint)bVar39;
          psVar44->scan_n = uVar74;
          if (((byte)(bVar39 - 5) < 0xfc) || (psVar51 = psVar44->s, psVar51->img_n < (int)uVar74))
          goto LAB_001cb8bd;
          if (iVar40 != uVar74 * 2 + 6) {
            stbi__g_failure_reason = "bad SOS len";
            goto LAB_001cb8c4;
          }
          lVar55 = 0;
          do {
            pbVar45 = psVar51->img_buffer;
            pbVar46 = psVar51->img_buffer_end;
            if (pbVar45 < pbVar46) {
              psVar51->img_buffer = pbVar45 + 1;
              uVar67 = (uint)*pbVar45;
              pbVar45 = pbVar45 + 1;
            }
            else if (psVar51->read_from_callbacks == 0) {
              uVar67 = 0;
            }
            else {
              psVar61 = psVar51->buffer_start;
              iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
              if (iVar40 == 0) {
                psVar51->read_from_callbacks = 0;
                psVar60 = psVar51->buffer_start + 1;
                psVar51->buffer_start[0] = '\0';
                uVar67 = 0;
              }
              else {
                psVar60 = psVar61 + iVar40;
                uVar67 = (uint)*psVar61;
              }
              psVar51->img_buffer_end = psVar60;
              psVar51->img_buffer = psVar51->buffer_start + 1;
              psVar51 = psVar44->s;
              pbVar45 = psVar51->img_buffer;
              pbVar46 = psVar51->img_buffer_end;
            }
            if (pbVar45 < pbVar46) {
              psVar51->img_buffer = pbVar45 + 1;
              uVar42 = (uint)*pbVar45;
            }
            else if (psVar51->read_from_callbacks == 0) {
              uVar42 = 0;
            }
            else {
              psVar61 = psVar51->buffer_start;
              iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
              if (iVar40 == 0) {
                psVar51->read_from_callbacks = 0;
                psVar60 = psVar51->buffer_start + 1;
                psVar51->buffer_start[0] = '\0';
                uVar42 = 0;
              }
              else {
                psVar60 = psVar61 + iVar40;
                uVar42 = (uint)*psVar61;
              }
              psVar51->img_buffer_end = psVar60;
              psVar51->img_buffer = psVar51->buffer_start + 1;
              psVar51 = psVar44->s;
            }
            uVar74 = psVar51->img_n;
            if ((long)(int)uVar74 < 1) {
              uVar71 = 0;
            }
            else {
              uVar71 = 0;
              paVar57 = paVar1;
              while (paVar57->id != uVar67) {
                uVar71 = uVar71 + 1;
                paVar57 = paVar57 + 1;
                if ((long)(int)uVar74 == uVar71) goto LAB_001cb8cb;
              }
            }
            if ((uint)uVar71 == uVar74) goto LAB_001cb8cb;
            uVar72 = uVar71 & 0xffffffff;
            paVar57 = (anon_struct_96_18_0d0905d3 *)(uVar72 * 0x60);
            psVar44->img_comp[uVar72].hd = uVar42 >> 4;
            if (0x3f < (byte)uVar42) {
              stbi__g_failure_reason = "bad DC huff";
              goto LAB_001cb8c4;
            }
            paVar57 = paVar1 + uVar72;
            paVar57->ha = uVar42 & 0xf;
            if (3 < (uVar42 & 0xf)) {
              stbi__g_failure_reason = "bad AC huff";
              goto LAB_001cb8c4;
            }
            psVar44->order[lVar55] = (uint)uVar71;
            lVar55 = lVar55 + 1;
          } while (lVar55 < psVar44->scan_n);
          pbVar46 = psVar51->img_buffer;
          pbVar45 = psVar51->img_buffer_end;
          if (pbVar46 < pbVar45) {
            psVar51->img_buffer = pbVar46 + 1;
            bVar39 = *pbVar46;
            pbVar46 = pbVar46 + 1;
          }
          else if (psVar51->read_from_callbacks == 0) {
            bVar39 = 0;
          }
          else {
            psVar61 = psVar51->buffer_start;
            iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
            if (iVar40 == 0) {
              psVar51->read_from_callbacks = 0;
              psVar60 = psVar51->buffer_start + 1;
              psVar51->buffer_start[0] = '\0';
              bVar39 = 0;
            }
            else {
              psVar60 = psVar61 + iVar40;
              bVar39 = *psVar61;
            }
            psVar51->img_buffer_end = psVar60;
            psVar51->img_buffer = psVar51->buffer_start + 1;
            psVar51 = psVar44->s;
            pbVar46 = psVar51->img_buffer;
            pbVar45 = psVar51->img_buffer_end;
          }
          psVar44->spec_start = (uint)bVar39;
          if (pbVar46 < pbVar45) {
            psVar51->img_buffer = pbVar46 + 1;
            uVar74 = (uint)*pbVar46;
            pbVar46 = pbVar46 + 1;
          }
          else if (psVar51->read_from_callbacks == 0) {
            uVar74 = 0;
          }
          else {
            psVar61 = psVar51->buffer_start;
            iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
            if (iVar40 == 0) {
              psVar51->read_from_callbacks = 0;
              psVar60 = psVar51->buffer_start + 1;
              psVar51->buffer_start[0] = '\0';
              uVar74 = 0;
            }
            else {
              psVar60 = psVar61 + iVar40;
              uVar74 = (uint)*psVar61;
            }
            psVar51->img_buffer_end = psVar60;
            psVar51->img_buffer = psVar51->buffer_start + 1;
            psVar51 = psVar44->s;
            pbVar46 = psVar51->img_buffer;
            pbVar45 = psVar51->img_buffer_end;
          }
          psVar44->spec_end = uVar74;
          if (pbVar46 < pbVar45) {
            psVar51->img_buffer = pbVar46 + 1;
            uVar74 = (uint)*pbVar46;
          }
          else if (psVar51->read_from_callbacks == 0) {
            uVar74 = 0;
          }
          else {
            psVar61 = psVar51->buffer_start;
            iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
            if (iVar40 == 0) {
              psVar51->read_from_callbacks = 0;
              psVar60 = psVar51->buffer_start + 1;
              psVar51->buffer_start[0] = '\0';
              uVar74 = 0;
            }
            else {
              psVar60 = psVar61 + iVar40;
              uVar74 = (uint)*psVar61;
            }
            psVar51->img_buffer_end = psVar60;
            psVar51->img_buffer = psVar51->buffer_start + 1;
          }
          psVar44->succ_high = uVar74 >> 4;
          uVar67 = uVar74 & 0xf;
          paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar67;
          psVar44->succ_low = uVar67;
          iVar40 = psVar44->progressive;
          iVar68 = psVar44->spec_start;
          if (iVar40 == 0) {
            if ((iVar68 != 0) || ((0xf < (byte)uVar74 || (uVar67 != 0)))) {
LAB_001cc1dc:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_001cb8c4;
            }
            psVar44->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar68) || (0x3f < psVar44->spec_end)) || (psVar44->spec_end < iVar68))
                  || ((0xdf < (byte)uVar74 || (0xd < uVar67)))) goto LAB_001cc1dc;
          uVar74 = psVar44->scan_n;
          uVar71 = (ulong)uVar74;
          iVar68 = psVar44->restart_interval;
          if (iVar68 == 0) {
            iVar68 = 0x7fffffff;
          }
          psVar44->code_buffer = 0;
          psVar44->code_bits = 0;
          psVar44->nomore = 0;
          psVar44->img_comp[3].dc_pred = 0;
          psVar44->img_comp[2].dc_pred = 0;
          psVar44->img_comp[1].dc_pred = 0;
          psVar44->img_comp[0].dc_pred = 0;
          psVar44->marker = 0xff;
          psVar44->todo = iVar68;
          psVar44->eob_run = 0;
          if (iVar40 == 0) {
            if (uVar74 == 1) {
              iVar40 = psVar44->order[0];
              iVar68 = psVar44->img_comp[iVar40].y + 7 >> 3;
              bVar76 = true;
              uVar74 = 1;
              if (0 < iVar68) {
                uVar67 = paVar1[iVar40].x + 7 >> 3;
                iVar66 = 0;
                iVar65 = 0;
                do {
                  if (0 < (int)uVar67) {
                    lVar55 = 0;
                    do {
                      iVar62 = stbi__jpeg_decode_block
                                         (psVar44,(short *)&local_88a8,
                                          (stbi__huffman *)psVar44->huff_dc[paVar1[iVar40].hd].fast,
                                          (stbi__huffman *)psVar44->huff_ac[paVar1[iVar40].ha].fast,
                                          psVar44->fast_ac[paVar1[iVar40].ha],iVar40,
                                          psVar44->dequant[paVar1[iVar40].tq]);
                      uVar74 = extraout_EDX_02;
                      if (iVar62 == 0) goto LAB_001cafaa;
                      (*psVar44->idct_block_kernel)
                                (paVar1[iVar40].data + lVar55 + iVar66 * paVar1[iVar40].w2,
                                 paVar1[iVar40].w2,(short *)&local_88a8);
                      uVar74 = (uint)extraout_RDX_02;
                      iVar62 = psVar44->todo;
                      psVar44->todo = iVar62 + -1;
                      uVar71 = extraout_RDX_02;
                      if (iVar62 < 2) {
                        if (psVar44->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar44);
                          uVar74 = extraout_EDX_03;
                        }
                        if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_001caba1;
                        psVar44->code_buffer = 0;
                        psVar44->code_bits = 0;
                        psVar44->nomore = 0;
                        psVar44->img_comp[3].dc_pred = 0;
                        psVar44->img_comp[2].dc_pred = 0;
                        psVar44->img_comp[1].dc_pred = 0;
                        psVar44->img_comp[0].dc_pred = 0;
                        psVar44->marker = 0xff;
                        iVar62 = psVar44->restart_interval;
                        uVar71 = 0x7fffffff;
                        if (iVar62 == 0) {
                          iVar62 = 0x7fffffff;
                        }
                        psVar44->todo = iVar62;
                        psVar44->eob_run = 0;
                      }
                      lVar55 = lVar55 + 8;
                    } while ((ulong)uVar67 * 8 != lVar55);
                  }
                  uVar74 = (uint)uVar71;
                  iVar65 = iVar65 + 1;
                  iVar66 = iVar66 + 8;
                } while (iVar65 != iVar68);
LAB_001caba1:
                bVar76 = true;
              }
            }
            else {
              uVar74 = psVar44->img_mcu_y;
              uVar71 = (ulong)uVar74;
              bVar76 = true;
              if (0 < (int)uVar74) {
                iVar40 = psVar44->img_mcu_x;
                iVar65 = 0;
                do {
                  if (0 < iVar40) {
                    uVar67 = 0;
                    do {
                      iVar40 = psVar44->scan_n;
                      if (0 < iVar40) {
                        uVar71 = 0;
                        do {
                          iVar68 = psVar44->order[uVar71];
                          iVar66 = psVar44->img_comp[iVar68].v;
                          if (0 < iVar66) {
                            iVar40 = paVar1[iVar68].h;
                            iVar62 = 0;
                            local_88c8 = uVar71;
                            do {
                              if (0 < iVar40) {
                                iVar66 = 0;
                                do {
                                  iVar73 = paVar1[iVar68].v;
                                  iVar43 = stbi__jpeg_decode_block
                                                     (psVar44,(short *)&local_88a8,
                                                      (stbi__huffman *)
                                                      psVar44->huff_dc[paVar1[iVar68].hd].fast,
                                                      (stbi__huffman *)
                                                      psVar44->huff_ac[paVar1[iVar68].ha].fast,
                                                      psVar44->fast_ac[paVar1[iVar68].ha],iVar68,
                                                      psVar44->dequant[paVar1[iVar68].tq]);
                                  uVar74 = extraout_EDX_05;
                                  if (iVar43 == 0) goto LAB_001cafaa;
                                  (*psVar44->idct_block_kernel)
                                            (paVar1[iVar68].data +
                                             (long)(int)((iVar40 * uVar67 + iVar66) * 8) +
                                             (long)((iVar73 * iVar65 + iVar62) * paVar1[iVar68].w2 *
                                                   8),paVar1[iVar68].w2,(short *)&local_88a8);
                                  iVar66 = iVar66 + 1;
                                  iVar40 = paVar1[iVar68].h;
                                } while (iVar66 < iVar40);
                                iVar66 = paVar1[iVar68].v;
                              }
                              iVar62 = iVar62 + 1;
                            } while (iVar62 < iVar66);
                            iVar40 = psVar44->scan_n;
                            uVar71 = local_88c8;
                          }
                          uVar71 = uVar71 + 1;
                        } while ((long)uVar71 < (long)iVar40);
                        iVar68 = psVar44->todo;
                      }
                      uVar74 = (uint)uVar71;
                      bVar76 = true;
                      psVar44->todo = iVar68 + -1;
                      bVar8 = iVar68 < 2;
                      iVar68 = iVar68 + -1;
                      if (bVar8) {
                        if (psVar44->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar44);
                          uVar74 = extraout_EDX_06;
                        }
                        if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_001cafac;
                        psVar44->code_buffer = 0;
                        psVar44->code_bits = 0;
                        psVar44->nomore = 0;
                        psVar44->img_comp[3].dc_pred = 0;
                        psVar44->img_comp[2].dc_pred = 0;
                        psVar44->img_comp[1].dc_pred = 0;
                        psVar44->img_comp[0].dc_pred = 0;
                        psVar44->marker = 0xff;
                        iVar68 = psVar44->restart_interval;
                        if (iVar68 == 0) {
                          iVar68 = 0x7fffffff;
                        }
                        psVar44->todo = iVar68;
                        psVar44->eob_run = 0;
                      }
                      uVar67 = uVar67 + 1;
                      uVar71 = (ulong)uVar67;
                      iVar40 = psVar44->img_mcu_x;
                    } while ((int)uVar67 < iVar40);
                    uVar71 = (ulong)(uint)psVar44->img_mcu_y;
                  }
                  bVar76 = true;
                  iVar65 = iVar65 + 1;
                  uVar74 = (uint)uVar71;
                } while (iVar65 < (int)uVar74);
              }
            }
            goto LAB_001cafac;
          }
          if (uVar74 == 1) {
            iVar40 = psVar44->order[0];
            iVar68 = psVar44->img_comp[iVar40].y + 7 >> 3;
            if (0 < iVar68) {
              local_88b8 = paVar1 + iVar40;
              iVar65 = psVar44->img_comp[iVar40].x + 7 >> 3;
              local_8934 = 0;
              do {
                if (0 < iVar65) {
                  iVar66 = 0;
                  do {
                    psVar64 = local_88b8->coeff + (local_88b8->coeff_w * local_8934 + iVar66) * 0x40
                    ;
                    uVar71 = (ulong)psVar44->spec_start;
                    local_88c8 = CONCAT44(local_88c8._4_4_,iVar66);
                    if (uVar71 == 0) {
                      iVar66 = stbi__jpeg_decode_block_prog_dc
                                         (psVar44,psVar64,
                                          (stbi__huffman *)psVar44->huff_dc[local_88b8->hd].fast,
                                          iVar40);
                      uVar74 = extraout_EDX_01;
                      if (iVar66 == 0) goto LAB_001cb8cb;
                    }
                    else {
                      iVar66 = local_88b8->ha;
                      iVar62 = psVar44->eob_run;
                      bVar39 = (byte)psVar44->succ_low;
                      if (psVar44->succ_high == 0) {
                        if (iVar62 == 0) {
                          paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar44->code_bits;
                          do {
                            if ((int)paVar57 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar44);
                            }
                            uVar74 = psVar44->code_buffer;
                            uVar72 = (ulong)(uVar74 >> 0x17);
                            sVar4 = psVar44->fast_ac[iVar66][uVar72];
                            uVar67 = (uint)sVar4;
                            iVar62 = (int)uVar71;
                            if (sVar4 == 0) {
                              if (psVar44->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar44);
                                uVar74 = psVar44->code_buffer;
                                uVar72 = (ulong)(uVar74 >> 0x17);
                              }
                              uVar71 = (ulong)psVar44->huff_ac[iVar66].fast[uVar72];
                              if (uVar71 == 0xff) {
                                lVar55 = 0;
                                do {
                                  lVar54 = lVar55;
                                  lVar55 = lVar54 + 1;
                                } while (psVar44->huff_ac[iVar66].maxcode[lVar54 + 10] <=
                                         uVar74 >> 0x10);
                                uVar67 = psVar44->code_bits;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar67;
                                if (lVar55 == 8) goto LAB_001ccf21;
                                if ((int)uVar67 < (int)(lVar54 + 10)) goto LAB_001ccf2b;
                                uVar71 = (ulong)(int)((uVar74 >> (0x17U - (char)lVar55 & 0x1f) &
                                                      stbi__bmask[lVar54 + 10]) +
                                                     psVar44->huff_ac[iVar66].delta[lVar54 + 10]);
                                bVar2 = psVar44->huff_ac[iVar66].size[uVar71];
                                if ((uVar74 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                    (uint)psVar44->huff_ac[iVar66].code[uVar71]) goto LAB_001cd567;
                                uVar67 = (uVar67 - (int)lVar55) - 9;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar67;
                                psVar44->code_bits = uVar67;
                                sVar41 = uVar74 << ((byte)(lVar54 + 10) & 0x1f);
                                psVar44->code_buffer = sVar41;
                              }
                              else {
                                bVar2 = psVar44->huff_ac[iVar66].size[uVar71];
                                uVar67 = psVar44->code_bits - (uint)bVar2;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar67;
                                if (psVar44->code_bits < (int)(uint)bVar2) goto LAB_001ccf2b;
                                sVar41 = uVar74 << (bVar2 & 0x1f);
                                psVar44->code_buffer = sVar41;
                                psVar44->code_bits = uVar67;
                              }
                              bVar2 = psVar44->huff_ac[iVar66].values[uVar71];
                              uVar74 = bVar2 & 0xf;
                              bVar30 = bVar2 >> 4;
                              uVar67 = (uint)bVar30;
                              iVar73 = (int)paVar57;
                              if ((bVar2 & 0xf) == 0) {
                                if (bVar2 < 0xf0) {
                                  iVar62 = 1 << bVar30;
                                  psVar44->eob_run = iVar62;
                                  if (0xf < bVar2) {
                                    if (iVar73 < (int)uVar67) {
                                      stbi__grow_buffer_unsafe(psVar44);
                                      sVar41 = psVar44->code_buffer;
                                      iVar73 = psVar44->code_bits;
                                      iVar62 = psVar44->eob_run;
                                    }
                                    uVar42 = sVar41 << bVar30 | sVar41 >> 0x20 - bVar30;
                                    uVar74 = stbi__bmask[uVar67];
                                    psVar44->code_buffer = ~uVar74 & uVar42;
                                    iVar62 = iVar62 + (uVar42 & uVar74);
                                    psVar44->code_bits = iVar73 - uVar67;
                                  }
                                  goto LAB_001ca350;
                                }
                                uVar74 = iVar62 + 0x10;
                              }
                              else {
                                lVar55 = (long)iVar62 + (ulong)uVar67;
                                bVar2 = ""[lVar55];
                                if (iVar73 < (int)uVar74) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar41 = psVar44->code_buffer;
                                  iVar73 = psVar44->code_bits;
                                }
                                uVar42 = sVar41 << (sbyte)uVar74 | sVar41 >> 0x20 - (sbyte)uVar74;
                                uVar67 = *(uint *)((long)stbi__bmask + (ulong)(uVar74 * 4));
                                psVar44->code_buffer = ~uVar67 & uVar42;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar73 - uVar74);
                                psVar44->code_bits = iVar73 - uVar74;
                                iVar62 = 0;
                                if (-1 < (int)sVar41) {
                                  iVar62 = *(int *)((long)stbi__jbias + (ulong)(uVar74 * 4));
                                }
                                uVar74 = (int)lVar55 + 1;
                                psVar64[bVar2] =
                                     (short)((uVar42 & uVar67) + iVar62 << (bVar39 & 0x1f));
                              }
                            }
                            else {
                              lVar55 = (long)iVar62 + (ulong)(uVar67 >> 4 & 0xf);
                              psVar44->code_buffer = uVar74 << (sbyte)(uVar67 & 0xf);
                              uVar74 = psVar44->code_bits - (uVar67 & 0xf);
                              paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar74;
                              psVar44->code_bits = uVar74;
                              uVar74 = (int)lVar55 + 1;
                              psVar64[""[lVar55]] = (short)((uVar67 >> 8) << (bVar39 & 0x1f));
                            }
                            uVar71 = (ulong)uVar74;
                          } while ((int)uVar74 <= psVar44->spec_end);
                        }
                        else {
LAB_001ca350:
                          psVar44->eob_run = iVar62 + -1;
                        }
                      }
                      else if (iVar62 == 0) {
                        iVar62 = 0x10000 << (bVar39 & 0x1f);
                        paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar44->code_bits;
                        do {
                          if ((int)paVar57 < 0x10) {
                            stbi__grow_buffer_unsafe(psVar44);
                          }
                          uVar74 = psVar44->code_buffer;
                          uVar72 = (ulong)psVar44->huff_ac[iVar66].fast[uVar74 >> 0x17];
                          if (uVar72 == 0xff) {
                            lVar55 = 0;
                            do {
                              lVar54 = lVar55;
                              lVar55 = lVar54 + 1;
                            } while (psVar44->huff_ac[iVar66].maxcode[lVar54 + 10] <= uVar74 >> 0x10
                                    );
                            uVar67 = psVar44->code_bits;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar67;
                            if (lVar55 == 8) goto LAB_001ccf21;
                            if ((int)uVar67 < (int)(lVar54 + 10)) goto LAB_001ccf2b;
                            uVar72 = (ulong)(int)((uVar74 >> (0x17U - (char)lVar55 & 0x1f) &
                                                  stbi__bmask[lVar54 + 10]) +
                                                 psVar44->huff_ac[iVar66].delta[lVar54 + 10]);
                            bVar2 = psVar44->huff_ac[iVar66].size[uVar72];
                            if ((uVar74 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                (uint)psVar44->huff_ac[iVar66].code[uVar72]) {
LAB_001cd567:
                              __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/stb/include/stb_image.h"
                                            ,0x79d,
                                            "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                           );
                            }
                            uVar67 = (uVar67 - (int)lVar55) - 9;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar67;
                            psVar44->code_bits = uVar67;
                            sVar41 = uVar74 << ((byte)(lVar54 + 10) & 0x1f);
                            psVar44->code_buffer = sVar41;
                          }
                          else {
                            bVar2 = psVar44->huff_ac[iVar66].size[uVar72];
                            uVar67 = psVar44->code_bits - (uint)bVar2;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar67;
                            if (psVar44->code_bits < (int)(uint)bVar2) goto LAB_001ccf2b;
                            sVar41 = uVar74 << (bVar2 & 0x1f);
                            psVar44->code_buffer = sVar41;
                            psVar44->code_bits = uVar67;
                          }
                          iVar73 = (int)paVar57;
                          bVar2 = psVar44->huff_ac[iVar66].values[uVar72];
                          bVar30 = bVar2 >> 4;
                          uVar74 = (uint)bVar30;
                          uVar72 = (ulong)uVar74;
                          if ((bVar2 & 0xf) == 1) {
                            if (iVar73 < 1) {
                              stbi__grow_buffer_unsafe(psVar44);
                              sVar41 = psVar44->code_buffer;
                              iVar73 = psVar44->code_bits;
                            }
                            sVar63 = sVar41 * 2;
                            psVar44->code_buffer = sVar63;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar73 - 1U);
                            local_8944._0_2_ =
                                 (short)(((int)~sVar41 >> 0x1f | 1U) << (bVar39 & 0x1f));
                            psVar44->code_bits = iVar73 - 1U;
                          }
                          else {
                            if ((bVar2 & 0xf) != 0) goto LAB_001ccf2b;
                            if (bVar2 < 0xf0) {
                              uVar67 = ~(-1 << bVar30);
                              psVar44->eob_run = uVar67;
                              uVar69 = 0x40;
                              if (0xf < bVar2) {
                                if (iVar73 < (int)uVar74) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar41 = psVar44->code_buffer;
                                  iVar73 = psVar44->code_bits;
                                  uVar67 = psVar44->eob_run;
                                }
                                uVar56 = sVar41 << bVar30 | sVar41 >> 0x20 - bVar30;
                                uVar42 = stbi__bmask[uVar72];
                                sVar63 = ~uVar42 & uVar56;
                                psVar44->code_buffer = sVar63;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar73 - uVar74);
                                psVar44->code_bits = iVar73 - uVar74;
                                psVar44->eob_run = (uVar56 & uVar42) + uVar67;
                                local_8944._0_2_ = 0;
                                uVar72 = uVar69;
                                goto LAB_001ca58d;
                              }
                            }
                            else {
                              uVar69 = 0xf;
                            }
                            local_8944._0_2_ = 0;
                            uVar72 = uVar69;
                            sVar63 = sVar41;
                          }
LAB_001ca58d:
                          uVar74 = psVar44->spec_end;
                          uVar69 = (ulong)uVar74;
                          if ((int)uVar71 <= (int)uVar74) {
                            uVar59 = (long)(int)uVar71;
                            do {
                              uVar74 = (uint)uVar69;
                              iVar73 = (int)paVar57;
                              bVar2 = ""[uVar59];
                              if (psVar64[bVar2] == 0) {
                                if ((int)uVar72 == 0) {
                                  uVar71 = (ulong)((int)uVar59 + 1);
                                  psVar64[bVar2] = (short)local_8944;
                                  break;
                                }
                                uVar72 = (ulong)((int)uVar72 - 1);
                              }
                              else {
                                if (iVar73 < 1) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar63 = psVar44->code_buffer;
                                  iVar73 = psVar44->code_bits;
                                }
                                sVar41 = sVar63 * 2;
                                psVar44->code_buffer = sVar41;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar73 - 1U);
                                psVar44->code_bits = iVar73 - 1U;
                                bVar76 = (int)sVar63 < 0;
                                sVar63 = sVar41;
                                if ((bVar76) &&
                                   (sVar4 = psVar64[bVar2], (iVar62 >> 0x10 & (int)sVar4) == 0)) {
                                  sVar31 = (short)((uint)iVar62 >> 0x10);
                                  if (sVar4 < 1) {
                                    sVar31 = -sVar31;
                                  }
                                  psVar64[bVar2] = sVar4 + sVar31;
                                }
                              }
                              uVar71 = uVar59 + 1;
                              uVar74 = psVar44->spec_end;
                              uVar69 = (ulong)(int)uVar74;
                              bVar76 = (long)uVar59 < (long)uVar69;
                              uVar59 = uVar71;
                            } while (bVar76);
                          }
                        } while ((int)uVar71 <= (int)uVar74);
                      }
                      else {
                        psVar44->eob_run = iVar62 + -1;
                        if (psVar44->spec_start <= psVar44->spec_end) {
                          uVar74 = (0x10000 << (bVar39 & 0x1f)) >> 0x10;
                          do {
                            bVar39 = ""[uVar71];
                            if (psVar64[bVar39] != 0) {
                              iVar66 = psVar44->code_bits;
                              if (iVar66 < 1) {
                                stbi__grow_buffer_unsafe(psVar44);
                                iVar66 = psVar44->code_bits;
                              }
                              sVar41 = psVar44->code_buffer;
                              psVar44->code_buffer = sVar41 * 2;
                              psVar44->code_bits = iVar66 + -1;
                              if (((int)sVar41 < 0) &&
                                 (sVar4 = psVar64[bVar39], (uVar74 & (int)sVar4) == 0)) {
                                uVar67 = -uVar74;
                                if (0 < sVar4) {
                                  uVar67 = uVar74;
                                }
                                psVar64[bVar39] = (short)uVar67 + sVar4;
                              }
                            }
                            bVar76 = (long)uVar71 < (long)psVar44->spec_end;
                            uVar71 = uVar71 + 1;
                          } while (bVar76);
                        }
                      }
                    }
                    iVar66 = psVar44->todo;
                    psVar44->todo = iVar66 + -1;
                    if (iVar66 < 2) {
                      if (psVar44->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar44);
                      }
                      bVar39 = psVar44->marker;
                      if ((bVar39 & 0xf8) != 0xd0) goto LAB_001cafc4;
                      psVar44->code_buffer = 0;
                      psVar44->code_bits = 0;
                      psVar44->nomore = 0;
                      psVar44->img_comp[3].dc_pred = 0;
                      psVar44->img_comp[2].dc_pred = 0;
                      psVar44->img_comp[1].dc_pred = 0;
                      psVar44->img_comp[0].dc_pred = 0;
                      psVar44->marker = 0xff;
                      iVar66 = psVar44->restart_interval;
                      if (iVar66 == 0) {
                        iVar66 = 0x7fffffff;
                      }
                      psVar44->todo = iVar66;
                      psVar44->eob_run = 0;
                    }
                    iVar66 = (int)local_88c8 + 1;
                  } while (iVar66 != iVar65);
                }
                local_8934 = local_8934 + 1;
              } while (local_8934 != iVar68);
            }
          }
          else {
            iVar40 = psVar44->img_mcu_y;
            if (0 < iVar40) {
              iVar65 = psVar44->img_mcu_x;
              iVar66 = 0;
              do {
                if (0 < iVar65) {
                  iVar40 = 0;
                  do {
                    iVar65 = psVar44->scan_n;
                    if (0 < iVar65) {
                      lVar55 = 0;
                      do {
                        iVar68 = psVar44->order[lVar55];
                        iVar62 = psVar44->img_comp[iVar68].v;
                        if (0 < iVar62) {
                          iVar65 = paVar1[iVar68].h;
                          iVar73 = 0;
                          do {
                            if (0 < iVar65) {
                              iVar62 = 0;
                              do {
                                iVar65 = stbi__jpeg_decode_block_prog_dc
                                                   (psVar44,paVar1[iVar68].coeff +
                                                            (iVar65 * iVar40 + iVar62 +
                                                            (paVar1[iVar68].v * iVar66 + iVar73) *
                                                            paVar1[iVar68].coeff_w) * 0x40,
                                                    (stbi__huffman *)
                                                    psVar44->huff_dc[paVar1[iVar68].hd].fast,iVar68)
                                ;
                                uVar74 = extraout_EDX_04;
                                if (iVar65 == 0) goto LAB_001cb8cb;
                                iVar62 = iVar62 + 1;
                                iVar65 = paVar1[iVar68].h;
                              } while (iVar62 < iVar65);
                              iVar62 = paVar1[iVar68].v;
                            }
                            iVar73 = iVar73 + 1;
                          } while (iVar73 < iVar62);
                          iVar65 = psVar44->scan_n;
                        }
                        lVar55 = lVar55 + 1;
                      } while (lVar55 < iVar65);
                      iVar68 = psVar44->todo;
                    }
                    psVar44->todo = iVar68 + -1;
                    bVar76 = iVar68 < 2;
                    iVar68 = iVar68 + -1;
                    if (bVar76) {
                      if (psVar44->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar44);
                      }
                      bVar39 = psVar44->marker;
                      if ((bVar39 & 0xf8) != 0xd0) goto LAB_001cafc4;
                      psVar44->code_buffer = 0;
                      psVar44->code_bits = 0;
                      psVar44->nomore = 0;
                      psVar44->img_comp[3].dc_pred = 0;
                      psVar44->img_comp[2].dc_pred = 0;
                      psVar44->img_comp[1].dc_pred = 0;
                      psVar44->img_comp[0].dc_pred = 0;
                      psVar44->marker = 0xff;
                      iVar68 = psVar44->restart_interval;
                      if (iVar68 == 0) {
                        iVar68 = 0x7fffffff;
                      }
                      psVar44->todo = iVar68;
                      psVar44->eob_run = 0;
                    }
                    iVar40 = iVar40 + 1;
                    iVar65 = psVar44->img_mcu_x;
                  } while (iVar40 < iVar65);
                  iVar40 = psVar44->img_mcu_y;
                }
                iVar66 = iVar66 + 1;
              } while (iVar66 < iVar40);
            }
          }
          goto LAB_001cafb9;
        }
        uVar74 = (uint)bVar39;
        if (uVar74 == 0xdc) {
          iVar40 = stbi__get16be(psVar44->s);
          sVar41 = stbi__get16be(psVar44->s);
          paVar57 = extraout_RDX;
          if (iVar40 == 4) {
            if (sVar41 == psVar44->s->img_y) goto LAB_001c9ca3;
            stbi__g_failure_reason = "bad DNL height";
          }
          else {
            stbi__g_failure_reason = "bad DNL len";
          }
          goto LAB_001cb8c4;
        }
        if (uVar74 == 0xd9) {
          psVar47 = psVar44->s;
          uVar74 = psVar47->img_n;
          if (psVar44->progressive == 0) goto LAB_001cb774;
          if ((int)uVar74 < 1) {
            uVar67 = req_comp + (uint)(req_comp == 0);
            bVar76 = false;
          }
          else {
            lVar55 = 0;
            do {
              iVar40 = psVar44->img_comp[lVar55].y + 7 >> 3;
              if (0 < iVar40) {
                uVar74 = paVar1[lVar55].x + 7 >> 3;
                iVar68 = 0;
                do {
                  if (0 < (int)uVar74) {
                    uVar71 = 0;
                    do {
                      psVar64 = paVar1[lVar55].coeff +
                                (paVar1[lVar55].coeff_w * iVar68 + (int)uVar71) * 0x40;
                      iVar65 = paVar1[lVar55].tq;
                      lVar54 = 0;
                      do {
                        psVar64[lVar54] = psVar64[lVar54] * psVar44->dequant[iVar65][lVar54];
                        lVar54 = lVar54 + 1;
                      } while (lVar54 != 0x40);
                      (*psVar44->idct_block_kernel)
                                (paVar1[lVar55].data +
                                 uVar71 * 8 + (long)(iVar68 * 8 * paVar1[lVar55].w2),
                                 paVar1[lVar55].w2,psVar64);
                      uVar71 = uVar71 + 1;
                    } while (uVar71 != uVar74);
                  }
                  iVar68 = iVar68 + 1;
                } while (iVar68 != iVar40);
                psVar47 = psVar44->s;
              }
              lVar55 = lVar55 + 1;
              uVar74 = psVar47->img_n;
            } while (lVar55 < (int)uVar74);
LAB_001cb774:
            uVar67 = (2 < (int)uVar74) + 1 + (uint)(2 < (int)uVar74);
            if (req_comp != 0) {
              uVar67 = req_comp;
            }
            uVar42 = uVar74;
            if (uVar74 == 3) {
              bVar76 = true;
              uVar74 = 3;
              if (psVar44->rgb != 3) {
                uVar42 = 3;
                if (psVar44->app14_color_transform != 0) goto LAB_001cb7af;
                bVar76 = psVar44->jfif == 0;
              }
            }
            else {
LAB_001cb7af:
              uVar74 = uVar42;
              bVar76 = false;
            }
          }
          uVar42 = 1;
          if (bVar76) {
            uVar42 = uVar74;
          }
          if (uVar74 != 3) {
            uVar42 = uVar74;
          }
          if (2 < (int)uVar67) {
            uVar42 = uVar74;
          }
          sVar41 = psVar47->img_x;
          if ((int)uVar42 < 1) {
LAB_001cc7cd:
            sVar63 = psVar47->img_y;
            psVar51 = (stbi__context *)stbi__malloc_mad3(uVar67,sVar41,sVar63,1);
            iVar40 = (int)extraout_RDX_03;
            if (psVar51 != (stbi__context *)0x0) {
              if (sVar63 != 0) {
                iVar68 = 0;
                uVar74 = 0;
                uVar71 = extraout_RDX_03;
                do {
                  sVar41 = psVar47->img_x;
                  if (0 < (int)uVar42) {
                    pasVar75 = (stbi_uc (*) [4])&local_88a8.ratio;
                    uVar72 = 0;
                    piVar70 = &psVar44->img_comp[0].y;
                    do {
                      asVar5 = pasVar75[-1];
                      asVar6 = pasVar75[-3];
                      iVar40 = (int)asVar6 >> 1;
                      auVar115 = (**(code **)(pasVar75 + -10))
                                           (*(stbi_uc **)(piVar70 + 10),
                                            *(undefined8 *)
                                             (*pasVar75 +
                                             ((ulong)(iVar40 <= (int)asVar5) << 3 |
                                             0xffffffffffffffe0)),
                                            *(undefined8 *)
                                             (*pasVar75 +
                                             ((ulong)((int)asVar5 < iVar40) << 3 |
                                             0xffffffffffffffe0)),pasVar75[-2],pasVar75[-4]);
                      uVar71 = auVar115._8_8_;
                      *(long *)(&local_88e8.bpp + uVar72 * 2) = auVar115._0_8_;
                      pasVar75[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar6 <= (int)asVar5 + 1) {
                        pasVar75[-1] = (stbi_uc  [4])0x0;
                        *(stbi_uc **)(pasVar75 + -8) = *(stbi_uc **)(pasVar75 + -6);
                        asVar5 = *pasVar75;
                        *pasVar75 = (stbi_uc  [4])((int)asVar5 + 1);
                        if ((int)asVar5 + 1 < *piVar70) {
                          *(stbi_uc **)(pasVar75 + -6) = *(stbi_uc **)(pasVar75 + -6) + piVar70[1];
                        }
                      }
                      uVar72 = uVar72 + 1;
                      piVar70 = piVar70 + 0x18;
                      pasVar75 = pasVar75 + 0xc;
                    } while (uVar42 != uVar72);
                  }
                  if (2 < (int)uVar67) {
                    psVar61 = (stbi_uc *)CONCAT44(local_88e8.offset,local_88e8.bpp);
                    psVar47 = psVar44->s;
                    if (psVar47->img_n == 3) {
                      if (bVar76) {
                        if (psVar47->img_x != 0) {
                          psVar60 = psVar51->buffer_start + ((ulong)(sVar41 * iVar68) - 0x35);
                          uVar71 = 0;
                          do {
                            psVar60[-3] = psVar61[uVar71];
                            psVar60[-2] = *(undefined1 *)
                                           (CONCAT44(local_88e8.mr,local_88e8.hsz) + uVar71);
                            psVar60[-1] = *(undefined1 *)
                                           (CONCAT44(local_88e8.mb,local_88e8.mg) + uVar71);
                            *psVar60 = 0xff;
                            uVar71 = uVar71 + 1;
                            psVar60 = psVar60 + uVar67;
                          } while (uVar71 < psVar47->img_x);
                        }
                      }
                      else {
LAB_001ccca0:
                        (*psVar44->YCbCr_to_RGB_kernel)
                                  (psVar51->buffer_start +
                                   ((ulong)(uVar74 * uVar67 * sVar41) - 0x38),psVar61,
                                   (stbi_uc *)CONCAT44(local_88e8.mr,local_88e8.hsz),
                                   (stbi_uc *)CONCAT44(local_88e8.mb,local_88e8.mg),psVar47->img_x,
                                   uVar67);
                        psVar47 = psVar44->s;
                        uVar71 = extraout_RDX_04;
                      }
                    }
                    else if (psVar47->img_n == 4) {
                      if (psVar44->app14_color_transform == 2) {
                        (*psVar44->YCbCr_to_RGB_kernel)
                                  (psVar51->buffer_start +
                                   ((ulong)(uVar74 * uVar67 * sVar41) - 0x38),psVar61,
                                   (stbi_uc *)CONCAT44(local_88e8.mr,local_88e8.hsz),
                                   (stbi_uc *)CONCAT44(local_88e8.mb,local_88e8.mg),psVar47->img_x,
                                   uVar67);
                        psVar47 = psVar44->s;
                        uVar71 = extraout_RDX_05;
                        if (psVar47->img_x != 0) {
                          psVar61 = psVar51->buffer_start + ((ulong)(sVar41 * iVar68) - 0x36);
                          uVar72 = 0;
                          do {
                            bVar39 = *(byte *)(CONCAT44(local_88e8.all_a,local_88e8.ma) + uVar72);
                            iVar40 = (psVar61[-2] ^ 0xff) * (uint)bVar39;
                            psVar61[-2] = (byte)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                            iVar40 = (psVar61[-1] ^ 0xff) * (uint)bVar39;
                            psVar61[-1] = (byte)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                            iVar40 = (*psVar61 ^ 0xff) * (uint)bVar39;
                            uVar56 = iVar40 + 0x80U >> 8;
                            uVar71 = (ulong)uVar56;
                            *psVar61 = (byte)(iVar40 + uVar56 + 0x80 >> 8);
                            uVar72 = uVar72 + 1;
                            psVar61 = psVar61 + uVar67;
                          } while (uVar72 < psVar47->img_x);
                        }
                      }
                      else {
                        if (psVar44->app14_color_transform != 0) goto LAB_001ccca0;
                        if (psVar47->img_x != 0) {
                          uVar71 = CONCAT44(local_88e8.mb,local_88e8.mg);
                          psVar60 = psVar51->buffer_start + ((ulong)(sVar41 * iVar68) - 0x35);
                          uVar72 = 0;
                          do {
                            bVar39 = *(byte *)(CONCAT44(local_88e8.all_a,local_88e8.ma) + uVar72);
                            iVar40 = (uint)psVar61[uVar72] * (uint)bVar39;
                            psVar60[-3] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                            iVar40 = (uint)*(byte *)(CONCAT44(local_88e8.mr,local_88e8.hsz) + uVar72
                                                    ) * (uint)bVar39;
                            psVar60[-2] = (char)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                            iVar40 = (uint)*(byte *)(uVar71 + uVar72) * (uint)bVar39;
                            psVar60[-1] = (char)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                            *psVar60 = 0xff;
                            uVar72 = uVar72 + 1;
                            psVar60 = psVar60 + uVar67;
                          } while (uVar72 < psVar47->img_x);
                        }
                      }
                    }
                    else if (psVar47->img_x != 0) {
                      psVar60 = psVar51->buffer_start + ((ulong)(sVar41 * iVar68) - 0x35);
                      uVar72 = 0;
                      do {
                        sVar38 = psVar61[uVar72];
                        psVar60[-1] = sVar38;
                        psVar60[-2] = sVar38;
                        psVar60[-3] = sVar38;
                        *psVar60 = 0xff;
                        uVar72 = uVar72 + 1;
                        psVar60 = psVar60 + uVar67;
                      } while (uVar72 < psVar47->img_x);
                    }
                    goto LAB_001cce80;
                  }
                  psVar47 = psVar44->s;
                  if (bVar76) {
                    if (uVar67 == 1) {
                      if (psVar47->img_x != 0) {
                        uVar71 = 0;
                        do {
                          bVar39 = *(byte *)(CONCAT44(local_88e8.mb,local_88e8.mg) + uVar71);
                          psVar51->buffer_start[uVar71 + sVar41 * iVar68 + -0x38] =
                               (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                         (uint)*(byte *)(CONCAT44(local_88e8.mr,local_88e8.hsz) +
                                                        uVar71) * 0x96 +
                                         (uint)*(byte *)(CONCAT44(local_88e8.offset,local_88e8.bpp)
                                                        + uVar71) * 0x4d >> 8);
                          uVar71 = uVar71 + 1;
                        } while (uVar71 < psVar47->img_x);
LAB_001ccd38:
                        uVar71 = CONCAT44(local_88e8.mb,local_88e8.mg);
                      }
                    }
                    else if (psVar47->img_x != 0) {
                      uVar71 = 0;
                      do {
                        bVar39 = *(byte *)(CONCAT44(local_88e8.mb,local_88e8.mg) + uVar71);
                        psVar51->buffer_start[uVar71 * 2 + (ulong)(sVar41 * iVar68) + -0x38] =
                             (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                       (uint)*(byte *)(CONCAT44(local_88e8.mr,local_88e8.hsz) +
                                                      uVar71) * 0x96 +
                                       (uint)*(byte *)(CONCAT44(local_88e8.offset,local_88e8.bpp) +
                                                      uVar71) * 0x4d >> 8);
                        psVar51->buffer_start[uVar71 * 2 + (ulong)(sVar41 * iVar68) + -0x37] = 0xff;
                        uVar71 = uVar71 + 1;
                      } while (uVar71 < psVar47->img_x);
                      goto LAB_001ccd38;
                    }
                  }
                  else if (psVar47->img_n == 4) {
                    if (psVar44->app14_color_transform == 2) {
                      if (psVar47->img_x != 0) {
                        psVar61 = psVar51->buffer_start + ((ulong)(sVar41 * iVar68) - 0x37);
                        uVar71 = 0;
                        do {
                          iVar40 = (*(byte *)(CONCAT44(local_88e8.offset,local_88e8.bpp) + uVar71) ^
                                   0xff) * (uint)*(byte *)(CONCAT44(local_88e8.all_a,local_88e8.ma)
                                                          + uVar71);
                          psVar61[-1] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          *psVar61 = 0xff;
                          uVar71 = uVar71 + 1;
                          psVar61 = psVar61 + uVar67;
                        } while (uVar71 < psVar47->img_x);
                      }
                    }
                    else {
                      if (psVar44->app14_color_transform != 0) goto LAB_001ccc2d;
                      if (psVar47->img_x != 0) {
                        uVar71 = CONCAT44(local_88e8.mr,local_88e8.hsz);
                        psVar61 = psVar51->buffer_start + ((ulong)(sVar41 * iVar68) - 0x37);
                        uVar72 = 0;
                        do {
                          bVar39 = *(byte *)(CONCAT44(local_88e8.all_a,local_88e8.ma) + uVar72);
                          iVar40 = (uint)*(byte *)(CONCAT44(local_88e8.offset,local_88e8.bpp) +
                                                  uVar72) * (uint)bVar39;
                          iVar65 = (uint)*(byte *)(uVar71 + uVar72) * (uint)bVar39;
                          iVar66 = (uint)*(byte *)(CONCAT44(local_88e8.mb,local_88e8.mg) + uVar72) *
                                   (uint)bVar39;
                          psVar61[-1] = (char)(((iVar66 + 0x80U >> 8) + iVar66 + 0x80 >> 8) * 0x1d +
                                               (iVar65 + (iVar65 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                               (iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8) * 0x4d
                                              >> 8);
                          *psVar61 = 0xff;
                          uVar72 = uVar72 + 1;
                          psVar61 = psVar61 + uVar67;
                        } while (uVar72 < psVar47->img_x);
                      }
                    }
                  }
                  else {
LAB_001ccc2d:
                    if (uVar67 == 1) {
                      if (psVar47->img_x != 0) {
                        uVar72 = 0;
                        do {
                          psVar51->buffer_start[uVar72 + sVar41 * iVar68 + -0x38] =
                               *(stbi_uc *)(CONCAT44(local_88e8.offset,local_88e8.bpp) + uVar72);
                          uVar72 = uVar72 + 1;
                          uVar71 = (ulong)psVar47->img_x;
                        } while (uVar72 < uVar71);
                      }
                    }
                    else if (psVar47->img_x != 0) {
                      uVar72 = 0;
                      do {
                        psVar51->buffer_start[uVar72 * 2 + (ulong)(sVar41 * iVar68) + -0x38] =
                             *(stbi_uc *)(CONCAT44(local_88e8.offset,local_88e8.bpp) + uVar72);
                        psVar51->buffer_start[uVar72 * 2 + (ulong)(sVar41 * iVar68) + -0x37] = 0xff;
                        uVar72 = uVar72 + 1;
                        uVar71 = (ulong)psVar47->img_x;
                      } while (uVar72 < uVar71);
                    }
                  }
LAB_001cce80:
                  iVar40 = (int)uVar71;
                  uVar74 = uVar74 + 1;
                  iVar68 = iVar68 + uVar67;
                } while (uVar74 < psVar47->img_y);
                uVar74 = psVar47->img_n;
              }
              stbi__free_jpeg_components(psVar44,uVar74,iVar40);
              psVar47 = psVar44->s;
              *x = psVar47->img_x;
              *y = psVar47->img_y;
              if (comp != (int *)0x0) {
                *comp = (uint)(2 < psVar47->img_n) * 2 + 1;
              }
              goto LAB_001cb8e5;
            }
            stbi__free_jpeg_components(psVar44,uVar74,iVar40);
            stbi__g_failure_reason = "outofmem";
            goto LAB_001cb8df;
          }
          lVar55 = 0;
          while( true ) {
            pvVar49 = malloc((ulong)(sVar41 + 3));
            *(void **)((long)&psVar44->img_comp[0].linebuf + lVar55 * 2) = pvVar49;
            if (pvVar49 == (void *)0x0) break;
            uVar71 = (long)psVar44->img_h_max /
                     (long)*(int *)((long)&psVar44->img_comp[0].h + lVar55 * 2);
            iVar40 = (int)uVar71;
            *(int *)((long)(local_88a8.pal + -7) + lVar55) = iVar40;
            iVar68 = psVar44->img_v_max / *(int *)((long)&psVar44->img_comp[0].v + lVar55 * 2);
            *(int *)((long)(local_88a8.pal + -6) + lVar55) = iVar68;
            *(int *)((long)(local_88a8.pal + -4) + lVar55) = iVar68 >> 1;
            *(int *)((long)(local_88a8.pal + -5) + lVar55) =
                 (int)((ulong)((sVar41 - 1) + iVar40) / (uVar71 & 0xffffffff));
            *(undefined4 *)((long)(local_88a8.pal + -3) + lVar55) = 0;
            uVar7 = *(undefined8 *)((long)&psVar44->img_comp[0].data + lVar55 * 2);
            *(undefined8 *)((long)(local_88a8.pal + -9) + lVar55) = uVar7;
            *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar55) = uVar7;
            if (iVar40 == 2) {
              pcVar50 = stbi__resample_row_h_2;
              if (iVar68 != 1) {
                if (iVar68 != 2) goto LAB_001cc7b1;
                pcVar50 = psVar44->resample_row_hv_2_kernel;
              }
            }
            else if (iVar40 == 1) {
              pcVar50 = stbi__resample_row_generic;
              if (iVar68 == 2) {
                pcVar50 = stbi__resample_row_v_2;
              }
              if (iVar68 == 1) {
                pcVar50 = resample_row_1;
              }
            }
            else {
LAB_001cc7b1:
              pcVar50 = stbi__resample_row_generic;
            }
            *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar55) = pcVar50;
            lVar55 = lVar55 + 0x30;
            if ((ulong)uVar42 * 0x30 == lVar55) goto LAB_001cc7cd;
          }
          stbi__free_jpeg_components(psVar44,uVar74,why);
          stbi__g_failure_reason = "outofmem";
          psVar51 = (stbi__context *)0x0;
          goto LAB_001cb8e5;
        }
        iVar40 = stbi__process_marker(psVar44,uVar74);
        uVar74 = extraout_EDX_00;
        if (iVar40 != 0) goto LAB_001c9ca3;
      }
LAB_001cb8cb:
      stbi__free_jpeg_components(psVar44,psVar44->s->img_n,uVar74);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_001cb8df:
    psVar51 = (stbi__context *)0x0;
LAB_001cb8e5:
    free(psVar44);
  }
  else {
    iVar40 = stbi__check_png_header(s);
    psVar53 = s->img_buffer_original;
    psVar60 = s->img_buffer_original_end;
    s->img_buffer = psVar53;
    s->img_buffer_end = psVar60;
    if (iVar40 != 0) {
      if ((uint)req_comp < 5) {
        local_88a8._0_8_ = s;
        iVar40 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
        uVar7 = local_88a8._0_8_;
        if (iVar40 == 0) {
          psVar51 = (stbi__context *)0x0;
        }
        else {
          iVar40 = 8;
          if (8 < local_88a8.flags) {
            iVar40 = local_88a8.flags;
          }
          ri->bits_per_channel = iVar40;
          psVar51 = (stbi__context *)local_88a8.history;
          if ((req_comp != 0) && (iVar40 = *(int *)(local_88a8._0_8_ + 0xc), iVar40 != req_comp)) {
            if (local_88a8.flags < 9) {
              psVar51 = (stbi__context *)
                        stbi__convert_format
                                  (local_88a8.history,iVar40,req_comp,
                                   *(stbi__uint32 *)local_88a8._0_8_,
                                   *(stbi__uint32 *)(local_88a8._0_8_ + 4));
            }
            else {
              psVar51 = (stbi__context *)
                        stbi__convert_format16
                                  ((stbi__uint16 *)local_88a8.history,iVar40,req_comp,
                                   *(stbi__uint32 *)local_88a8._0_8_,
                                   *(stbi__uint32 *)(local_88a8._0_8_ + 4));
            }
            *(int *)(uVar7 + 0xc) = req_comp;
            if (psVar51 == (stbi__context *)0x0) goto LAB_001c9bae;
          }
          *x = *(stbi__uint32 *)uVar7;
          *y = *(stbi__uint32 *)(uVar7 + 4);
          if (comp != (int *)0x0) {
            *comp = *(int *)(uVar7 + 8);
          }
          local_88a8.history = (stbi_uc *)0x0;
        }
        free(local_88a8.history);
        free(local_88a8.background);
        psVar44 = (stbi__jpeg *)local_88a8.out;
        goto LAB_001cb8e5;
      }
      stbi__g_failure_reason = "bad req_comp";
      goto LAB_001c9bae;
    }
    if (psVar53 < psVar60) {
      psVar48 = psVar53 + 1;
      s->img_buffer = psVar48;
      sVar38 = *psVar53;
LAB_001cb1e5:
      if (sVar38 != 'B') goto LAB_001cb3c9;
      if (psVar48 < psVar60) {
        s->img_buffer = psVar48 + 1;
        sVar38 = *psVar48;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_001cb3c9;
        psVar60 = s->buffer_start;
        iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
        if (iVar40 == 0) {
          s->read_from_callbacks = 0;
          psVar53 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar38 = '\0';
        }
        else {
          psVar53 = psVar60 + iVar40;
          sVar38 = *psVar60;
        }
        s->img_buffer_end = psVar53;
        s->img_buffer = s->buffer_start + 1;
      }
      if (sVar38 != 'M') goto LAB_001cb3c9;
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      uVar74 = stbi__get16le(s);
      iVar40 = stbi__get16le(s);
      uVar74 = iVar40 << 0x10 | uVar74;
      if (((0x38 < uVar74) || ((0x100010000001000U >> ((ulong)uVar74 & 0x3f) & 1) == 0)) &&
         (uVar74 != 0x6c)) {
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if (uVar74 == 0x7c) goto LAB_001cb334;
        goto LAB_001cb3d9;
      }
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_001cb334:
      local_88e8.all_a = 0xff;
      pvVar49 = stbi__bmp_parse_header(s,&local_88e8);
      uVar74 = local_88e8.all_a;
      if (pvVar49 == (void *)0x0) goto LAB_001c9bae;
      local_88b0 = s->img_y;
      sVar41 = -local_88b0;
      if (0 < (int)local_88b0) {
        sVar41 = local_88b0;
      }
      s->img_y = sVar41;
      if (local_88e8.hsz == 0xc) {
        if (local_88e8.bpp < 0x18) {
          local_8970 = (ulong)(uint)((local_88e8.offset + -0x26) / 3);
        }
        else {
LAB_001cb52b:
          local_8970 = 0;
        }
      }
      else {
        if (0xf < local_88e8.bpp) goto LAB_001cb52b;
        local_8970 = (ulong)(uint)((local_88e8.offset - local_88e8.hsz) + -0xe >> 2);
      }
      iVar40 = 4 - (uint)(local_88e8.ma == 0);
      s->img_n = iVar40;
      if (2 < req_comp) {
        iVar40 = req_comp;
      }
      sVar63 = s->img_x;
      iVar68 = stbi__mad3sizes_valid(iVar40,sVar63,sVar41,0);
      if (iVar68 == 0) {
        stbi__g_failure_reason = "too large";
      }
      else {
        data_00 = (uchar *)stbi__malloc_mad3(iVar40,sVar63,sVar41,0);
        if (data_00 == (uchar *)0x0) {
          stbi__g_failure_reason = "outofmem";
        }
        else {
          if (local_88e8.bpp < 0x10) {
            iVar68 = (int)local_8970;
            if (0x100 < iVar68 || iVar68 == 0) {
              free(data_00);
              stbi__g_failure_reason = "invalid";
              goto LAB_001c9bae;
            }
            if (0 < iVar68) {
              psVar61 = s->buffer_start;
              psVar60 = s->buffer_start + 1;
              psVar53 = s->img_buffer;
              psVar48 = s->img_buffer_end;
              uVar71 = 0;
              do {
                if (psVar53 < psVar48) {
                  s->img_buffer = psVar53 + 1;
                  sVar38 = *psVar53;
                  psVar53 = psVar53 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar38 = '\0';
                }
                else {
                  iVar65 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                  if (iVar65 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar38 = '\0';
                    psVar48 = psVar60;
                  }
                  else {
                    sVar38 = *psVar61;
                    psVar48 = psVar61 + iVar65;
                  }
                  s->img_buffer_end = psVar48;
                  s->img_buffer = psVar60;
                  psVar53 = psVar60;
                }
                local_88a8.pal[uVar71 - 0xd][2] = sVar38;
                if (psVar53 < psVar48) {
                  s->img_buffer = psVar53 + 1;
                  sVar38 = *psVar53;
                  psVar53 = psVar53 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar38 = '\0';
                }
                else {
                  iVar65 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                  if (iVar65 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar38 = '\0';
                    psVar48 = psVar60;
                  }
                  else {
                    sVar38 = *psVar61;
                    psVar48 = psVar61 + iVar65;
                  }
                  s->img_buffer_end = psVar48;
                  s->img_buffer = psVar60;
                  psVar53 = psVar60;
                }
                local_88a8.pal[uVar71 - 0xd][1] = sVar38;
                if (psVar53 < psVar48) {
                  s->img_buffer = psVar53 + 1;
                  sVar38 = *psVar53;
                  psVar53 = psVar53 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar38 = '\0';
                }
                else {
                  iVar65 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                  if (iVar65 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar38 = '\0';
                    psVar48 = psVar60;
                  }
                  else {
                    sVar38 = *psVar61;
                    psVar48 = psVar61 + iVar65;
                  }
                  s->img_buffer_end = psVar48;
                  s->img_buffer = psVar60;
                  psVar53 = psVar60;
                }
                local_88a8.pal[uVar71 - 0xd][0] = sVar38;
                if (local_88e8.hsz != 0xc) {
                  if (psVar53 < psVar48) {
                    psVar53 = psVar53 + 1;
                  }
                  else {
                    if (s->read_from_callbacks == 0) goto LAB_001cbab7;
                    iVar65 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                    if (iVar65 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      psVar48 = psVar60;
                    }
                    else {
                      psVar48 = psVar61 + iVar65;
                    }
                    s->img_buffer_end = psVar48;
                    psVar53 = psVar60;
                  }
                  s->img_buffer = psVar53;
                }
LAB_001cbab7:
                local_88a8.pal[uVar71 - 0xd][3] = 0xff;
                uVar71 = uVar71 + 1;
              } while (local_8970 != uVar71);
            }
            stbi__skip(s,(iVar68 * (local_88e8.hsz == 0xc | 0xfffffffc) - local_88e8.hsz) +
                         local_88e8.offset + -0xe);
            if (local_88e8.bpp == 1) {
              sVar41 = s->img_y;
              if (0 < (int)sVar41) {
                sVar63 = s->img_x;
                psVar61 = s->buffer_start;
                psVar60 = s->buffer_start + 1;
                iVar65 = 0;
                iVar68 = 0;
                do {
                  psVar53 = s->img_buffer;
                  psVar48 = s->img_buffer_end;
                  if (psVar53 < psVar48) {
                    s->img_buffer = psVar53 + 1;
                    bVar39 = *psVar53;
                    psVar53 = psVar53 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar39 = 0;
                  }
                  else {
                    iVar66 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                    if (iVar66 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar39 = 0;
                      psVar48 = psVar60;
                    }
                    else {
                      bVar39 = *psVar61;
                      psVar48 = psVar61 + iVar66;
                    }
                    s->img_buffer_end = psVar48;
                    s->img_buffer = psVar60;
                    psVar53 = psVar60;
                  }
                  sVar41 = s->img_x;
                  if (0 < (int)sVar41) {
                    uVar67 = (uint)bVar39;
                    sVar58 = 0;
                    uVar42 = 7;
                    do {
                      uVar71 = (ulong)((uVar67 >> (uVar42 & 0x1f) & 1) != 0);
                      data_00[iVar65] = local_88a8.pal[uVar71 - 0xd][0];
                      data_00[(long)iVar65 + 1] = local_88a8.pal[uVar71 - 0xd][1];
                      data_00[(long)iVar65 + 2] = local_88a8.pal[uVar71 - 0xd][2];
                      iVar66 = iVar65 + 3;
                      if (iVar40 == 4) {
                        data_00[(long)iVar65 + 3] = 0xff;
                        iVar66 = iVar65 + 4;
                      }
                      iVar65 = iVar66;
                      sVar58 = sVar58 + 1;
                      if (sVar58 == sVar41) break;
                      if ((int)uVar42 < 1) {
                        if (psVar53 < psVar48) {
                          s->img_buffer = psVar53 + 1;
                          uVar67 = (uint)*psVar53;
                          psVar53 = psVar53 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          uVar67 = 0;
                        }
                        else {
                          iVar66 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                          if (iVar66 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            uVar67 = 0;
                            psVar48 = psVar60;
                          }
                          else {
                            uVar67 = (uint)*psVar61;
                            psVar48 = psVar61 + iVar66;
                          }
                          s->img_buffer_end = psVar48;
                          s->img_buffer = psVar60;
                          sVar41 = s->img_x;
                          psVar53 = psVar60;
                        }
                        uVar42 = 7;
                      }
                      else {
                        uVar42 = uVar42 - 1;
                      }
                    } while ((int)sVar58 < (int)sVar41);
                  }
                  stbi__skip(s,-(sVar63 + 7 >> 3) & 3);
                  iVar68 = iVar68 + 1;
                  sVar41 = s->img_y;
                } while (iVar68 < (int)sVar41);
              }
            }
            else {
              if (local_88e8.bpp == 8) {
                uVar67 = s->img_x;
              }
              else {
                if (local_88e8.bpp != 4) {
                  free(data_00);
                  stbi__g_failure_reason = "bad bpp";
                  goto LAB_001c9bae;
                }
                uVar67 = s->img_x + 1 >> 1;
              }
              sVar41 = s->img_y;
              if (0 < (int)sVar41) {
                local_8920 = -uVar67 & 3;
                psVar61 = s->buffer_start;
                psVar60 = s->buffer_start + 1;
                uVar71 = 0;
                iVar68 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    psVar53 = s->img_buffer;
                    psVar48 = s->img_buffer_end;
                    iVar65 = 0;
                    do {
                      if (psVar53 < psVar48) {
                        s->img_buffer = psVar53 + 1;
                        bVar39 = *psVar53;
                        psVar53 = psVar53 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar39 = 0;
                      }
                      else {
                        iVar66 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                        if (iVar66 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar39 = 0;
                          psVar48 = psVar60;
                        }
                        else {
                          bVar39 = *psVar61;
                          psVar48 = psVar61 + iVar66;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar60;
                        psVar53 = psVar60;
                      }
                      uVar67 = (uint)(bVar39 >> 4);
                      if (local_88e8.bpp != 4) {
                        uVar67 = (uint)bVar39;
                      }
                      uVar72 = (ulong)uVar67;
                      uVar67 = bVar39 & 0xf;
                      if (local_88e8.bpp != 4) {
                        uVar67 = 0;
                      }
                      lVar55 = (long)(int)uVar71;
                      uVar69 = lVar55 + 3;
                      data_00[lVar55] = local_88a8.pal[uVar72 - 0xd][0];
                      data_00[lVar55 + 1] = local_88a8.pal[uVar72 - 0xd][1];
                      data_00[lVar55 + 2] = local_88a8.pal[uVar72 - 0xd][2];
                      if (iVar40 == 4) {
                        data_00[lVar55 + 3] = 0xff;
                        uVar69 = (ulong)((int)uVar71 + 4);
                      }
                      if (iVar65 + 1U == s->img_x) {
                        uVar71 = uVar69 & 0xffffffff;
                        break;
                      }
                      if (local_88e8.bpp == 8) {
                        if (psVar53 < psVar48) {
                          s->img_buffer = psVar53 + 1;
                          bVar39 = *psVar53;
                          psVar53 = psVar53 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar66 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                          if (iVar66 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar48 = psVar60;
                          }
                          else {
                            bVar39 = *psVar61;
                            psVar48 = psVar61 + iVar66;
                          }
                          s->img_buffer_end = psVar48;
                          s->img_buffer = psVar60;
                          psVar53 = psVar60;
                        }
                        uVar67 = (uint)bVar39;
                      }
                      lVar55 = (long)(int)uVar69;
                      uVar71 = lVar55 + 3;
                      uVar72 = (ulong)uVar67;
                      data_00[lVar55] = local_88a8.pal[uVar72 - 0xd][0];
                      data_00[lVar55 + 1] = local_88a8.pal[uVar72 - 0xd][1];
                      data_00[lVar55 + 2] = local_88a8.pal[uVar72 - 0xd][2];
                      if (iVar40 == 4) {
                        data_00[lVar55 + 3] = 0xff;
                        uVar71 = (ulong)((int)uVar69 + 4);
                      }
                      iVar65 = iVar65 + 2;
                    } while (iVar65 < (int)s->img_x);
                  }
                  stbi__skip(s,local_8920);
                  iVar68 = iVar68 + 1;
                  sVar41 = s->img_y;
                } while (iVar68 < (int)sVar41);
              }
            }
          }
          else {
            stbi__skip(s,(local_88e8.offset - local_88e8.hsz) + -0xe);
            if (local_88e8.bpp == 0x10) {
              local_88ec = s->img_x * 2 & 2;
LAB_001cbc2e:
              if (local_88e8.mb == 0 || (local_88e8.mg == 0 || local_88e8.mr == 0)) {
                free(data_00);
                stbi__g_failure_reason = "bad masks";
                goto LAB_001c9bae;
              }
              iVar68 = stbi__high_bit(local_88e8.mr);
              iVar68 = iVar68 + -7;
              uVar67 = (local_88e8.mr >> 1 & 0x55555555) + (local_88e8.mr & 0x55555555);
              uVar67 = (uVar67 >> 2 & 0x33333333) + (uVar67 & 0x33333333);
              uVar67 = (uVar67 >> 4) + uVar67 & 0xf0f0f0f;
              uVar67 = (uVar67 >> 8) + uVar67;
              uVar67 = (uVar67 >> 0x10) + uVar67 & 0xff;
              iVar65 = stbi__high_bit(local_88e8.mg);
              local_88c8 = CONCAT44(local_88c8._4_4_,iVar65 + -7);
              uVar42 = (local_88e8.mg >> 1 & 0x55555555) + (local_88e8.mg & 0x55555555);
              uVar42 = (uVar42 >> 2 & 0x33333333) + (uVar42 & 0x33333333);
              uVar42 = (uVar42 >> 4) + uVar42 & 0xf0f0f0f;
              uVar42 = (uVar42 >> 8) + uVar42;
              local_8944 = (uVar42 >> 0x10) + uVar42 & 0xff;
              local_8934 = stbi__high_bit(local_88e8.mb);
              local_8934 = local_8934 + -7;
              uVar42 = (local_88e8.mb >> 1 & 0x55555555) + (local_88e8.mb & 0x55555555);
              uVar42 = (uVar42 >> 2 & 0x33333333) + (uVar42 & 0x33333333);
              uVar42 = (uVar42 >> 4) + uVar42 & 0xf0f0f0f;
              uVar42 = (uVar42 >> 8) + uVar42;
              local_88b8 = (anon_struct_96_18_0d0905d3 *)
                           (CONCAT44(local_88b8._4_4_,(uVar42 >> 0x10) + uVar42) &
                           0xffffffff000000ff);
              local_8904 = stbi__high_bit(local_88e8.ma);
              local_8904 = local_8904 + -7;
              uVar42 = (local_88e8.ma >> 1 & 0x55555555) + (local_88e8.ma & 0x55555555);
              uVar42 = (uVar42 >> 2 & 0x33333333) + (uVar42 & 0x33333333);
              uVar42 = (uVar42 >> 4) + uVar42 & 0xf0f0f0f;
              uVar42 = (uVar42 >> 8) + uVar42;
              local_88bc = (uVar42 >> 0x10) + uVar42 & 0xff;
              local_88c0 = 1;
              bVar76 = false;
            }
            else {
              if (local_88e8.bpp == 0x20) {
                local_88ec = 0;
                if (local_88e8.ma != 0xff000000 ||
                    (local_88e8.mr != 0xff0000 || (local_88e8.mg != 0xff00 || local_88e8.mb != 0xff)
                    )) goto LAB_001cbc2e;
                bVar76 = true;
              }
              else {
                local_88ec = 0;
                if (local_88e8.bpp != 0x18) goto LAB_001cbc2e;
                local_88ec = s->img_x & 3;
                bVar76 = false;
              }
              local_88c0 = 0;
              iVar68 = 0;
              local_88c8 = local_88c8 & 0xffffffff00000000;
              local_8934 = 0;
              local_8904 = 0;
              uVar67 = 0;
              local_8944 = 0;
              local_88b8 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88b8 & 0xffffffff00000000);
              local_88bc = 0;
            }
            sVar41 = s->img_y;
            if (0 < (int)sVar41) {
              psVar61 = s->buffer_start;
              psVar60 = s->buffer_start + 1;
              iVar66 = 0;
              iVar65 = 0;
              do {
                local_88ac = iVar65;
                if ((char)local_88c0 == '\0') {
                  if (0 < (int)s->img_x) {
                    psVar53 = s->img_buffer;
                    psVar48 = s->img_buffer_end;
                    iVar65 = 0;
                    do {
                      if (psVar53 < psVar48) {
                        s->img_buffer = psVar53 + 1;
                        bVar39 = *psVar53;
                        psVar53 = psVar53 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar39 = 0;
                      }
                      else {
                        iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                        if (iVar62 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar39 = 0;
                          psVar48 = psVar60;
                        }
                        else {
                          bVar39 = *psVar61;
                          psVar48 = psVar61 + iVar62;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar60;
                        psVar53 = psVar60;
                      }
                      data_00[(long)iVar66 + 2] = bVar39;
                      if (psVar53 < psVar48) {
                        s->img_buffer = psVar53 + 1;
                        bVar39 = *psVar53;
                        psVar53 = psVar53 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar39 = 0;
                      }
                      else {
                        iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                        if (iVar62 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar39 = 0;
                          psVar48 = psVar60;
                        }
                        else {
                          bVar39 = *psVar61;
                          psVar48 = psVar61 + iVar62;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar60;
                        psVar53 = psVar60;
                      }
                      data_00[(long)iVar66 + 1] = bVar39;
                      if (psVar53 < psVar48) {
                        s->img_buffer = psVar53 + 1;
                        bVar39 = *psVar53;
                        psVar53 = psVar53 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar39 = 0;
                      }
                      else {
                        iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                        if (iVar62 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar39 = 0;
                          psVar48 = psVar60;
                        }
                        else {
                          bVar39 = *psVar61;
                          psVar48 = psVar61 + iVar62;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar60;
                        psVar53 = psVar60;
                      }
                      data_00[iVar66] = bVar39;
                      bVar39 = 0xff;
                      if (bVar76) {
                        if (psVar53 < psVar48) {
                          s->img_buffer = psVar53 + 1;
                          bVar39 = *psVar53;
                          psVar53 = psVar53 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                          if (iVar62 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar48 = psVar60;
                          }
                          else {
                            bVar39 = *psVar61;
                            psVar48 = psVar61 + iVar62;
                          }
                          s->img_buffer_end = psVar48;
                          s->img_buffer = psVar60;
                          psVar53 = psVar60;
                        }
                      }
                      iVar62 = iVar66 + 3;
                      if (iVar40 == 4) {
                        data_00[(long)iVar66 + 3] = bVar39;
                        iVar62 = iVar66 + 4;
                      }
                      iVar66 = iVar62;
                      uVar74 = uVar74 | bVar39;
                      iVar65 = iVar65 + 1;
                    } while (iVar65 < (int)s->img_x);
                  }
                }
                else if (0 < (int)s->img_x) {
                  iVar65 = 0;
                  do {
                    uVar42 = stbi__get16le(s);
                    if (local_88e8.bpp != 0x10) {
                      iVar62 = stbi__get16le(s);
                      uVar42 = uVar42 | iVar62 << 0x10;
                    }
                    iVar62 = stbi__shiftsigned(uVar42 & local_88e8.mr,iVar68,uVar67);
                    data_00[iVar66] = (uchar)iVar62;
                    iVar62 = stbi__shiftsigned(uVar42 & local_88e8.mg,(int)local_88c8,local_8944);
                    data_00[(long)iVar66 + 1] = (uchar)iVar62;
                    iVar62 = stbi__shiftsigned(uVar42 & local_88e8.mb,local_8934,(int)local_88b8);
                    data_00[(long)iVar66 + 2] = (uchar)iVar62;
                    if (local_88e8.ma == 0) {
                      uVar42 = 0xff;
                    }
                    else {
                      uVar42 = stbi__shiftsigned(uVar42 & local_88e8.ma,local_8904,local_88bc);
                    }
                    iVar62 = iVar66 + 3;
                    if (iVar40 == 4) {
                      data_00[(long)iVar66 + 3] = (uchar)uVar42;
                      iVar62 = iVar66 + 4;
                    }
                    iVar66 = iVar62;
                    uVar74 = uVar74 | uVar42;
                    iVar65 = iVar65 + 1;
                  } while (iVar65 < (int)s->img_x);
                }
                stbi__skip(s,local_88ec);
                iVar65 = local_88ac + 1;
                sVar41 = s->img_y;
              } while (iVar65 < (int)sVar41);
            }
          }
          auVar37 = _DAT_0020ffe0;
          auVar36 = _DAT_0020ffd0;
          auVar35 = _DAT_0020ffc0;
          auVar34 = _DAT_0020ffb0;
          auVar33 = _DAT_001ed860;
          auVar32 = _DAT_001ec240;
          auVar115 = _DAT_001ec150;
          if (((iVar40 == 4) && (uVar74 == 0)) &&
             (uVar74 = s->img_x * sVar41 * 4 - 1, -1 < (int)uVar74)) {
            uVar67 = uVar74 >> 2;
            auVar77._4_4_ = 0;
            auVar77._0_4_ = uVar67;
            auVar77._8_4_ = uVar67;
            auVar77._12_4_ = 0;
            puVar52 = data_00 + uVar74;
            uVar71 = 0;
            do {
              auVar95._8_4_ = (int)uVar71;
              auVar95._0_8_ = uVar71;
              auVar95._12_4_ = (int)(uVar71 >> 0x20);
              auVar97 = auVar77 | auVar115;
              auVar99 = (auVar95 | auVar32) ^ auVar115;
              iVar68 = auVar97._0_4_;
              iVar73 = -(uint)(iVar68 < auVar99._0_4_);
              iVar65 = auVar97._4_4_;
              auVar101._4_4_ = -(uint)(iVar65 < auVar99._4_4_);
              iVar66 = auVar97._8_4_;
              iVar43 = -(uint)(iVar66 < auVar99._8_4_);
              iVar62 = auVar97._12_4_;
              auVar101._12_4_ = -(uint)(iVar62 < auVar99._12_4_);
              auVar78._4_4_ = iVar73;
              auVar78._0_4_ = iVar73;
              auVar78._8_4_ = iVar43;
              auVar78._12_4_ = iVar43;
              auVar78 = pshuflw(in_XMM1,auVar78,0xe8);
              auVar100._4_4_ = -(uint)(auVar99._4_4_ == iVar65);
              auVar100._12_4_ = -(uint)(auVar99._12_4_ == iVar62);
              auVar100._0_4_ = auVar100._4_4_;
              auVar100._8_4_ = auVar100._12_4_;
              auVar87 = pshuflw(in_XMM2,auVar100,0xe8);
              auVar101._0_4_ = auVar101._4_4_;
              auVar101._8_4_ = auVar101._12_4_;
              auVar99 = pshuflw(auVar78,auVar101,0xe8);
              auVar97._8_4_ = 0xffffffff;
              auVar97._0_8_ = 0xffffffffffffffff;
              auVar97._12_4_ = 0xffffffff;
              auVar97 = (auVar99 | auVar87 & auVar78) ^ auVar97;
              auVar97 = packssdw(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar52 = 0xff;
              }
              auVar87._4_4_ = iVar73;
              auVar87._0_4_ = iVar73;
              auVar87._8_4_ = iVar43;
              auVar87._12_4_ = iVar43;
              auVar101 = auVar100 & auVar87 | auVar101;
              auVar97 = packssdw(auVar101,auVar101);
              auVar99._8_4_ = 0xffffffff;
              auVar99._0_8_ = 0xffffffffffffffff;
              auVar99._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 ^ auVar99,auVar97 ^ auVar99);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._0_4_ >> 8 & 1) != 0) {
                puVar52[-4] = 0xff;
              }
              auVar97 = (auVar95 | auVar33) ^ auVar115;
              auVar88._0_4_ = -(uint)(iVar68 < auVar97._0_4_);
              auVar88._4_4_ = -(uint)(iVar65 < auVar97._4_4_);
              auVar88._8_4_ = -(uint)(iVar66 < auVar97._8_4_);
              auVar88._12_4_ = -(uint)(iVar62 < auVar97._12_4_);
              auVar102._4_4_ = auVar88._0_4_;
              auVar102._0_4_ = auVar88._0_4_;
              auVar102._8_4_ = auVar88._8_4_;
              auVar102._12_4_ = auVar88._8_4_;
              iVar73 = -(uint)(auVar97._4_4_ == iVar65);
              iVar43 = -(uint)(auVar97._12_4_ == iVar62);
              auVar18._4_4_ = iVar73;
              auVar18._0_4_ = iVar73;
              auVar18._8_4_ = iVar43;
              auVar18._12_4_ = iVar43;
              auVar112._4_4_ = auVar88._4_4_;
              auVar112._0_4_ = auVar88._4_4_;
              auVar112._8_4_ = auVar88._12_4_;
              auVar112._12_4_ = auVar88._12_4_;
              auVar97 = auVar18 & auVar102 | auVar112;
              auVar97 = packssdw(auVar97,auVar97);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 ^ auVar9,auVar97 ^ auVar9);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._0_4_ >> 0x10 & 1) != 0) {
                puVar52[-8] = 0xff;
              }
              auVar97 = pshufhw(auVar97,auVar102,0x84);
              auVar19._4_4_ = iVar73;
              auVar19._0_4_ = iVar73;
              auVar19._8_4_ = iVar43;
              auVar19._12_4_ = iVar43;
              auVar99 = pshufhw(auVar88,auVar19,0x84);
              auVar78 = pshufhw(auVar97,auVar112,0x84);
              auVar79._8_4_ = 0xffffffff;
              auVar79._0_8_ = 0xffffffffffffffff;
              auVar79._12_4_ = 0xffffffff;
              auVar79 = (auVar78 | auVar99 & auVar97) ^ auVar79;
              auVar97 = packssdw(auVar79,auVar79);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._0_4_ >> 0x18 & 1) != 0) {
                puVar52[-0xc] = 0xff;
              }
              auVar97 = (auVar95 | auVar37) ^ auVar115;
              auVar89._0_4_ = -(uint)(iVar68 < auVar97._0_4_);
              auVar89._4_4_ = -(uint)(iVar65 < auVar97._4_4_);
              auVar89._8_4_ = -(uint)(iVar66 < auVar97._8_4_);
              auVar89._12_4_ = -(uint)(iVar62 < auVar97._12_4_);
              auVar20._4_4_ = auVar89._0_4_;
              auVar20._0_4_ = auVar89._0_4_;
              auVar20._8_4_ = auVar89._8_4_;
              auVar20._12_4_ = auVar89._8_4_;
              auVar99 = pshuflw(auVar112,auVar20,0xe8);
              auVar80._0_4_ = -(uint)(auVar97._0_4_ == iVar68);
              auVar80._4_4_ = -(uint)(auVar97._4_4_ == iVar65);
              auVar80._8_4_ = -(uint)(auVar97._8_4_ == iVar66);
              auVar80._12_4_ = -(uint)(auVar97._12_4_ == iVar62);
              auVar103._4_4_ = auVar80._4_4_;
              auVar103._0_4_ = auVar80._4_4_;
              auVar103._8_4_ = auVar80._12_4_;
              auVar103._12_4_ = auVar80._12_4_;
              auVar97 = pshuflw(auVar80,auVar103,0xe8);
              auVar104._4_4_ = auVar89._4_4_;
              auVar104._0_4_ = auVar89._4_4_;
              auVar104._8_4_ = auVar89._12_4_;
              auVar104._12_4_ = auVar89._12_4_;
              auVar78 = pshuflw(auVar89,auVar104,0xe8);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 & auVar99,(auVar78 | auVar97 & auVar99) ^ auVar10);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar52[-0x10] = 0xff;
              }
              auVar21._4_4_ = auVar89._0_4_;
              auVar21._0_4_ = auVar89._0_4_;
              auVar21._8_4_ = auVar89._8_4_;
              auVar21._12_4_ = auVar89._8_4_;
              auVar104 = auVar103 & auVar21 | auVar104;
              auVar78 = packssdw(auVar104,auVar104);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97,auVar78 ^ auVar11);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._4_2_ >> 8 & 1) != 0) {
                puVar52[-0x14] = 0xff;
              }
              auVar97 = (auVar95 | auVar36) ^ auVar115;
              auVar90._0_4_ = -(uint)(iVar68 < auVar97._0_4_);
              auVar90._4_4_ = -(uint)(iVar65 < auVar97._4_4_);
              auVar90._8_4_ = -(uint)(iVar66 < auVar97._8_4_);
              auVar90._12_4_ = -(uint)(iVar62 < auVar97._12_4_);
              auVar105._4_4_ = auVar90._0_4_;
              auVar105._0_4_ = auVar90._0_4_;
              auVar105._8_4_ = auVar90._8_4_;
              auVar105._12_4_ = auVar90._8_4_;
              iVar73 = -(uint)(auVar97._4_4_ == iVar65);
              iVar43 = -(uint)(auVar97._12_4_ == iVar62);
              auVar22._4_4_ = iVar73;
              auVar22._0_4_ = iVar73;
              auVar22._8_4_ = iVar43;
              auVar22._12_4_ = iVar43;
              auVar113._4_4_ = auVar90._4_4_;
              auVar113._0_4_ = auVar90._4_4_;
              auVar113._8_4_ = auVar90._12_4_;
              auVar113._12_4_ = auVar90._12_4_;
              auVar97 = auVar22 & auVar105 | auVar113;
              auVar97 = packssdw(auVar97,auVar97);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 ^ auVar12,auVar97 ^ auVar12);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar52[-0x18] = 0xff;
              }
              auVar97 = pshufhw(auVar97,auVar105,0x84);
              auVar23._4_4_ = iVar73;
              auVar23._0_4_ = iVar73;
              auVar23._8_4_ = iVar43;
              auVar23._12_4_ = iVar43;
              auVar99 = pshufhw(auVar90,auVar23,0x84);
              auVar78 = pshufhw(auVar97,auVar113,0x84);
              auVar81._8_4_ = 0xffffffff;
              auVar81._0_8_ = 0xffffffffffffffff;
              auVar81._12_4_ = 0xffffffff;
              auVar81 = (auVar78 | auVar99 & auVar97) ^ auVar81;
              auVar97 = packssdw(auVar81,auVar81);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._6_2_ >> 8 & 1) != 0) {
                puVar52[-0x1c] = 0xff;
              }
              auVar97 = (auVar95 | auVar35) ^ auVar115;
              auVar91._0_4_ = -(uint)(iVar68 < auVar97._0_4_);
              auVar91._4_4_ = -(uint)(iVar65 < auVar97._4_4_);
              auVar91._8_4_ = -(uint)(iVar66 < auVar97._8_4_);
              auVar91._12_4_ = -(uint)(iVar62 < auVar97._12_4_);
              auVar24._4_4_ = auVar91._0_4_;
              auVar24._0_4_ = auVar91._0_4_;
              auVar24._8_4_ = auVar91._8_4_;
              auVar24._12_4_ = auVar91._8_4_;
              auVar99 = pshuflw(auVar113,auVar24,0xe8);
              auVar82._0_4_ = -(uint)(auVar97._0_4_ == iVar68);
              auVar82._4_4_ = -(uint)(auVar97._4_4_ == iVar65);
              auVar82._8_4_ = -(uint)(auVar97._8_4_ == iVar66);
              auVar82._12_4_ = -(uint)(auVar97._12_4_ == iVar62);
              auVar106._4_4_ = auVar82._4_4_;
              auVar106._0_4_ = auVar82._4_4_;
              auVar106._8_4_ = auVar82._12_4_;
              auVar106._12_4_ = auVar82._12_4_;
              auVar97 = pshuflw(auVar82,auVar106,0xe8);
              auVar107._4_4_ = auVar91._4_4_;
              auVar107._0_4_ = auVar91._4_4_;
              auVar107._8_4_ = auVar91._12_4_;
              auVar107._12_4_ = auVar91._12_4_;
              auVar78 = pshuflw(auVar91,auVar107,0xe8);
              auVar92._8_4_ = 0xffffffff;
              auVar92._0_8_ = 0xffffffffffffffff;
              auVar92._12_4_ = 0xffffffff;
              auVar92 = (auVar78 | auVar97 & auVar99) ^ auVar92;
              auVar78 = packssdw(auVar92,auVar92);
              auVar97 = packsswb(auVar97 & auVar99,auVar78);
              if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar52[-0x20] = 0xff;
              }
              auVar25._4_4_ = auVar91._0_4_;
              auVar25._0_4_ = auVar91._0_4_;
              auVar25._8_4_ = auVar91._8_4_;
              auVar25._12_4_ = auVar91._8_4_;
              auVar107 = auVar106 & auVar25 | auVar107;
              auVar78 = packssdw(auVar107,auVar107);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar78 = packssdw(auVar78 ^ auVar13,auVar78 ^ auVar13);
              auVar97 = packsswb(auVar97,auVar78);
              if ((auVar97._8_2_ >> 8 & 1) != 0) {
                puVar52[-0x24] = 0xff;
              }
              auVar97 = (auVar95 | auVar34) ^ auVar115;
              auVar93._0_4_ = -(uint)(iVar68 < auVar97._0_4_);
              auVar93._4_4_ = -(uint)(iVar65 < auVar97._4_4_);
              auVar93._8_4_ = -(uint)(iVar66 < auVar97._8_4_);
              auVar93._12_4_ = -(uint)(iVar62 < auVar97._12_4_);
              auVar108._4_4_ = auVar93._0_4_;
              auVar108._0_4_ = auVar93._0_4_;
              auVar108._8_4_ = auVar93._8_4_;
              auVar108._12_4_ = auVar93._8_4_;
              iVar73 = -(uint)(auVar97._4_4_ == iVar65);
              iVar43 = -(uint)(auVar97._12_4_ == iVar62);
              auVar26._4_4_ = iVar73;
              auVar26._0_4_ = iVar73;
              auVar26._8_4_ = iVar43;
              auVar26._12_4_ = iVar43;
              auVar114._4_4_ = auVar93._4_4_;
              auVar114._0_4_ = auVar93._4_4_;
              auVar114._8_4_ = auVar93._12_4_;
              auVar114._12_4_ = auVar93._12_4_;
              auVar97 = auVar26 & auVar108 | auVar114;
              auVar97 = packssdw(auVar97,auVar97);
              auVar14._8_4_ = 0xffffffff;
              auVar14._0_8_ = 0xffffffffffffffff;
              auVar14._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 ^ auVar14,auVar97 ^ auVar14);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar52[-0x28] = 0xff;
              }
              auVar97 = pshufhw(auVar97,auVar108,0x84);
              auVar27._4_4_ = iVar73;
              auVar27._0_4_ = iVar73;
              auVar27._8_4_ = iVar43;
              auVar27._12_4_ = iVar43;
              auVar99 = pshufhw(auVar93,auVar27,0x84);
              auVar78 = pshufhw(auVar97,auVar114,0x84);
              auVar83._8_4_ = 0xffffffff;
              auVar83._0_8_ = 0xffffffffffffffff;
              auVar83._12_4_ = 0xffffffff;
              auVar83 = (auVar78 | auVar99 & auVar97) ^ auVar83;
              auVar97 = packssdw(auVar83,auVar83);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._10_2_ >> 8 & 1) != 0) {
                puVar52[-0x2c] = 0xff;
              }
              auVar97 = (auVar95 | _DAT_0020ffa0) ^ auVar115;
              auVar94._0_4_ = -(uint)(iVar68 < auVar97._0_4_);
              auVar94._4_4_ = -(uint)(iVar65 < auVar97._4_4_);
              auVar94._8_4_ = -(uint)(iVar66 < auVar97._8_4_);
              auVar94._12_4_ = -(uint)(iVar62 < auVar97._12_4_);
              auVar28._4_4_ = auVar94._0_4_;
              auVar28._0_4_ = auVar94._0_4_;
              auVar28._8_4_ = auVar94._8_4_;
              auVar28._12_4_ = auVar94._8_4_;
              auVar99 = pshuflw(auVar114,auVar28,0xe8);
              auVar84._0_4_ = -(uint)(auVar97._0_4_ == iVar68);
              auVar84._4_4_ = -(uint)(auVar97._4_4_ == iVar65);
              auVar84._8_4_ = -(uint)(auVar97._8_4_ == iVar66);
              auVar84._12_4_ = -(uint)(auVar97._12_4_ == iVar62);
              auVar109._4_4_ = auVar84._4_4_;
              auVar109._0_4_ = auVar84._4_4_;
              auVar109._8_4_ = auVar84._12_4_;
              auVar109._12_4_ = auVar84._12_4_;
              auVar97 = pshuflw(auVar84,auVar109,0xe8);
              auVar110._4_4_ = auVar94._4_4_;
              auVar110._0_4_ = auVar94._4_4_;
              auVar110._8_4_ = auVar94._12_4_;
              auVar110._12_4_ = auVar94._12_4_;
              auVar78 = pshuflw(auVar94,auVar110,0xe8);
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 & auVar99,(auVar78 | auVar97 & auVar99) ^ auVar15);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar52[-0x30] = 0xff;
              }
              auVar29._4_4_ = auVar94._0_4_;
              auVar29._0_4_ = auVar94._0_4_;
              auVar29._8_4_ = auVar94._8_4_;
              auVar29._12_4_ = auVar94._8_4_;
              auVar110 = auVar109 & auVar29 | auVar110;
              auVar78 = packssdw(auVar110,auVar110);
              auVar16._8_4_ = 0xffffffff;
              auVar16._0_8_ = 0xffffffffffffffff;
              auVar16._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97,auVar78 ^ auVar16);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97._12_2_ >> 8 & 1) != 0) {
                puVar52[-0x34] = 0xff;
              }
              auVar97 = (auVar95 | _DAT_0020ff90) ^ auVar115;
              auVar85._0_4_ = -(uint)(iVar68 < auVar97._0_4_);
              auVar85._4_4_ = -(uint)(iVar65 < auVar97._4_4_);
              auVar85._8_4_ = -(uint)(iVar66 < auVar97._8_4_);
              auVar85._12_4_ = -(uint)(iVar62 < auVar97._12_4_);
              auVar111._4_4_ = auVar85._0_4_;
              auVar111._0_4_ = auVar85._0_4_;
              auVar111._8_4_ = auVar85._8_4_;
              auVar111._12_4_ = auVar85._8_4_;
              auVar96._4_4_ = -(uint)(auVar97._4_4_ == iVar65);
              auVar96._12_4_ = -(uint)(auVar97._12_4_ == iVar62);
              auVar96._0_4_ = auVar96._4_4_;
              auVar96._8_4_ = auVar96._12_4_;
              auVar98._4_4_ = auVar85._4_4_;
              auVar98._0_4_ = auVar85._4_4_;
              auVar98._8_4_ = auVar85._12_4_;
              auVar98._12_4_ = auVar85._12_4_;
              auVar78 = auVar96 & auVar111 | auVar98;
              auVar97 = packssdw(auVar85,auVar78);
              auVar17._8_4_ = 0xffffffff;
              auVar17._0_8_ = 0xffffffffffffffff;
              auVar17._12_4_ = 0xffffffff;
              auVar97 = packssdw(auVar97 ^ auVar17,auVar97 ^ auVar17);
              auVar97 = packsswb(auVar97,auVar97);
              if ((auVar97 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar52[-0x38] = 0xff;
              }
              auVar97 = pshufhw(auVar97,auVar111,0x84);
              in_XMM2 = pshufhw(auVar78,auVar96,0x84);
              in_XMM2 = in_XMM2 & auVar97;
              auVar97 = pshufhw(auVar97,auVar98,0x84);
              auVar86._8_4_ = 0xffffffff;
              auVar86._0_8_ = 0xffffffffffffffff;
              auVar86._12_4_ = 0xffffffff;
              auVar86 = (auVar97 | in_XMM2) ^ auVar86;
              auVar97 = packssdw(auVar86,auVar86);
              in_XMM1 = packsswb(auVar97,auVar97);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar52[-0x3c] = 0xff;
              }
              uVar71 = uVar71 + 0x10;
              puVar52 = puVar52 + -0x40;
            } while ((uVar67 + 0x10 & 0x3ffffff0) != uVar71);
          }
          if ((int)local_88b0 < 1) {
            uVar74 = s->img_x;
          }
          else {
            uVar74 = s->img_x;
            if (0 < (int)sVar41 >> 1) {
              uVar67 = uVar74 * iVar40;
              uVar42 = (sVar41 - 1) * uVar67;
              uVar71 = 0;
              uVar72 = 0;
              do {
                if (0 < (int)uVar67) {
                  uVar69 = 0;
                  do {
                    uVar3 = data_00[uVar69 + uVar71];
                    data_00[uVar69 + uVar71] = data_00[uVar69 + uVar42];
                    data_00[uVar69 + uVar42] = uVar3;
                    uVar69 = uVar69 + 1;
                  } while (uVar67 != uVar69);
                }
                uVar72 = uVar72 + 1;
                uVar42 = uVar42 - uVar67;
                uVar71 = (ulong)((int)uVar71 + uVar67);
              } while (uVar72 != (uint)((int)sVar41 >> 1));
            }
          }
          if ((req_comp == 0) || (iVar40 == req_comp)) {
LAB_001cd533:
            *x = uVar74;
            *y = s->img_y;
            if (comp == (int *)0x0) {
              return data_00;
            }
            *comp = s->img_n;
            return data_00;
          }
          data_00 = stbi__convert_format(data_00,iVar40,req_comp,uVar74,sVar41);
          if (data_00 != (uchar *)0x0) {
            uVar74 = s->img_x;
            goto LAB_001cd533;
          }
        }
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        psVar53 = s->buffer_start;
        iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar53,s->buflen);
        if (iVar40 == 0) {
          s->read_from_callbacks = 0;
          psVar60 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar38 = '\0';
        }
        else {
          psVar60 = psVar53 + iVar40;
          sVar38 = *psVar53;
        }
        s->img_buffer_end = psVar60;
        psVar48 = s->buffer_start + 1;
        s->img_buffer = psVar48;
        goto LAB_001cb1e5;
      }
LAB_001cb3c9:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_001cb3d9:
      iVar40 = stbi__gif_test(s);
      if (iVar40 != 0) {
        memset(&local_88a8,0,0x8870);
        psVar47 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar61);
        psVar51 = (stbi__context *)0x0;
        if (psVar47 != (stbi__context *)0x0 && psVar47 != s) {
          *x = local_88a8.w;
          *y = local_88a8.h;
          psVar51 = psVar47;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar51 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar47,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar44 = (stbi__jpeg *)local_88a8.background;
        goto LAB_001cb8e5;
      }
      iVar40 = stbi__psd_test(s);
      if (iVar40 != 0) {
        pvVar49 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
        return pvVar49;
      }
      iVar40 = stbi__pic_test(s);
      if (iVar40 != 0) {
        pvVar49 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar49;
      }
      iVar40 = stbi__pnm_test(s);
      if (iVar40 != 0) {
        pvVar49 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
        return pvVar49;
      }
      iVar40 = stbi__hdr_test(s);
      if (iVar40 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar61 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar61;
      }
      iVar40 = stbi__tga_test(s);
      if (iVar40 != 0) {
        pvVar49 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar49;
      }
      stbi__g_failure_reason = "unknown image type";
    }
LAB_001c9bae:
    psVar51 = (stbi__context *)0x0;
  }
  return psVar51;
LAB_001cafaa:
  bVar76 = false;
LAB_001cafac:
  if (!bVar76) goto LAB_001cb8cb;
LAB_001cafb9:
  bVar39 = psVar44->marker;
LAB_001cafc4:
  if (bVar39 == 0xff) {
LAB_001cafd1:
    do {
      psVar51 = psVar44->s;
      if ((psVar51->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001caff0:
        if (psVar51->img_buffer_end <= psVar51->img_buffer) goto LAB_001c9ca3;
      }
      else {
        iVar40 = (*(psVar51->io).eof)(psVar51->io_user_data);
        if (iVar40 != 0) {
          if (psVar51->read_from_callbacks != 0) goto LAB_001caff0;
          goto LAB_001c9ca3;
        }
      }
      psVar51 = psVar44->s;
      psVar61 = psVar51->img_buffer;
      if (psVar61 < psVar51->img_buffer_end) {
        psVar51->img_buffer = psVar61 + 1;
        sVar38 = *psVar61;
      }
      else {
        if (psVar51->read_from_callbacks == 0) goto LAB_001cafd1;
        psVar61 = psVar51->buffer_start;
        iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
        if (iVar40 == 0) {
          psVar51->read_from_callbacks = 0;
          psVar60 = psVar51->buffer_start + 1;
          psVar51->buffer_start[0] = '\0';
          sVar38 = '\0';
        }
        else {
          psVar60 = psVar61 + iVar40;
          sVar38 = *psVar61;
        }
        psVar51->img_buffer_end = psVar60;
        psVar51->img_buffer = psVar51->buffer_start + 1;
      }
    } while (sVar38 != 0xff);
    psVar51 = psVar44->s;
    psVar61 = psVar51->img_buffer;
    if (psVar61 < psVar51->img_buffer_end) {
      psVar51->img_buffer = psVar61 + 1;
      sVar38 = *psVar61;
    }
    else if (psVar51->read_from_callbacks == 0) {
      sVar38 = '\0';
    }
    else {
      psVar61 = psVar51->buffer_start;
      iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
      if (iVar40 == 0) {
        psVar51->read_from_callbacks = 0;
        psVar60 = psVar51->buffer_start + 1;
        psVar51->buffer_start[0] = '\0';
        sVar38 = '\0';
      }
      else {
        psVar60 = psVar61 + iVar40;
        sVar38 = *psVar61;
      }
      psVar51->img_buffer_end = psVar60;
      psVar51->img_buffer = psVar51->buffer_start + 1;
    }
    psVar44->marker = sVar38;
  }
LAB_001c9ca3:
  bVar39 = stbi__get_marker(psVar44);
  goto LAB_001c9c4d;
LAB_001ccf21:
  paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar67 - 0x10);
  psVar44->code_bits = uVar67 - 0x10;
LAB_001ccf2b:
  stbi__g_failure_reason = "bad huffman code";
LAB_001cb8c4:
  uVar74 = (uint)paVar57;
  goto LAB_001cb8cb;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}